

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersector1<8>::
     intersect_h<embree::avx512::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Primitive PVar13;
  int iVar14;
  Geometry *pGVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined8 uVar23;
  ulong uVar24;
  undefined8 uVar25;
  uint uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  long lVar71;
  byte bVar72;
  ulong uVar73;
  long lVar74;
  uint uVar75;
  uint uVar76;
  long lVar77;
  long lVar78;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  ulong uVar79;
  uint uVar80;
  byte bVar81;
  ulong uVar82;
  float fVar83;
  float fVar84;
  float fVar130;
  float fVar132;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar87 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar88 [16];
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar89 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar136;
  undefined4 uVar137;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar166;
  float fVar167;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar176;
  float fVar177;
  undefined1 auVar172 [32];
  float fVar178;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 in_ZMM25 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  int local_54c;
  ulong local_548;
  RayHit *local_540;
  RayQueryContext *local_538;
  ulong local_530;
  Precalculations *local_528;
  RTCFilterFunctionNArguments local_520;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [8];
  undefined8 uStack_4d8;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined8 local_4a0;
  undefined4 local_498;
  float local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  uint local_484;
  uint local_480;
  Primitive *local_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar13 = prim[1];
  uVar82 = (ulong)(byte)PVar13;
  fVar167 = *(float *)(prim + uVar82 * 0x19 + 0x12);
  auVar150 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar82 * 0x19 + 6));
  fVar166 = fVar167 * auVar150._0_4_;
  fVar136 = fVar167 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar82 * 4 + 6);
  auVar96 = vpmovsxbd_avx2(auVar85);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar82 * 5 + 6);
  auVar94 = vpmovsxbd_avx2(auVar86);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar82 * 6 + 6);
  auVar105 = vpmovsxbd_avx2(auVar6);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar82 * 0xb + 6);
  auVar104 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar13 * 0xc) + 6);
  auVar100 = vpmovsxbd_avx2(auVar8);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar97 = vcvtdq2ps_avx(auVar100);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (uint)(byte)PVar13 * 0xc + uVar82 + 6);
  auVar95 = vpmovsxbd_avx2(auVar9);
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar79 = (ulong)(uint)((int)(uVar82 * 9) * 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar79 + 6);
  auVar98 = vpmovsxbd_avx2(auVar10);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar79 + uVar82 + 6);
  auVar103 = vpmovsxbd_avx2(auVar11);
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar73 = (ulong)(uint)((int)(uVar82 * 5) << 2);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar73 + 6);
  auVar92 = vpmovsxbd_avx2(auVar12);
  auVar99 = vcvtdq2ps_avx(auVar92);
  auVar199._4_4_ = fVar136;
  auVar199._0_4_ = fVar136;
  auVar199._8_4_ = fVar136;
  auVar199._12_4_ = fVar136;
  auVar199._16_4_ = fVar136;
  auVar199._20_4_ = fVar136;
  auVar199._24_4_ = fVar136;
  auVar199._28_4_ = fVar136;
  auVar203._8_4_ = 1;
  auVar203._0_8_ = 0x100000001;
  auVar203._12_4_ = 1;
  auVar203._16_4_ = 1;
  auVar203._20_4_ = 1;
  auVar203._24_4_ = 1;
  auVar203._28_4_ = 1;
  auVar90 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar205 = ZEXT3264(auVar90);
  auVar102 = ZEXT1632(CONCAT412(fVar167 * (ray->super_RayK<1>).dir.field_0.m128[3],
                                CONCAT48(fVar167 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                         CONCAT44(fVar167 * (ray->super_RayK<1>).dir.field_0.m128[1]
                                                  ,fVar136))));
  auVar101 = vpermps_avx2(auVar203,auVar102);
  auVar91 = vpermps_avx512vl(auVar90,auVar102);
  fVar136 = auVar91._0_4_;
  fVar147 = auVar91._4_4_;
  auVar102._4_4_ = fVar147 * auVar105._4_4_;
  auVar102._0_4_ = fVar136 * auVar105._0_4_;
  fVar148 = auVar91._8_4_;
  auVar102._8_4_ = fVar148 * auVar105._8_4_;
  fVar149 = auVar91._12_4_;
  auVar102._12_4_ = fVar149 * auVar105._12_4_;
  fVar176 = auVar91._16_4_;
  auVar102._16_4_ = fVar176 * auVar105._16_4_;
  fVar177 = auVar91._20_4_;
  auVar102._20_4_ = fVar177 * auVar105._20_4_;
  fVar178 = auVar91._24_4_;
  auVar102._24_4_ = fVar178 * auVar105._24_4_;
  auVar102._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar95._4_4_ * fVar147;
  auVar100._0_4_ = auVar95._0_4_ * fVar136;
  auVar100._8_4_ = auVar95._8_4_ * fVar148;
  auVar100._12_4_ = auVar95._12_4_ * fVar149;
  auVar100._16_4_ = auVar95._16_4_ * fVar176;
  auVar100._20_4_ = auVar95._20_4_ * fVar177;
  auVar100._24_4_ = auVar95._24_4_ * fVar178;
  auVar100._28_4_ = auVar92._28_4_;
  auVar92._4_4_ = auVar99._4_4_ * fVar147;
  auVar92._0_4_ = auVar99._0_4_ * fVar136;
  auVar92._8_4_ = auVar99._8_4_ * fVar148;
  auVar92._12_4_ = auVar99._12_4_ * fVar149;
  auVar92._16_4_ = auVar99._16_4_ * fVar176;
  auVar92._20_4_ = auVar99._20_4_ * fVar177;
  auVar92._24_4_ = auVar99._24_4_ * fVar178;
  auVar92._28_4_ = auVar91._28_4_;
  auVar85 = vfmadd231ps_fma(auVar102,auVar101,auVar94);
  auVar86 = vfmadd231ps_fma(auVar100,auVar101,auVar97);
  auVar6 = vfmadd231ps_fma(auVar92,auVar103,auVar101);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar199,auVar96);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar199,auVar104);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar98,auVar199);
  auVar200._4_4_ = fVar166;
  auVar200._0_4_ = fVar166;
  auVar200._8_4_ = fVar166;
  auVar200._12_4_ = fVar166;
  auVar200._16_4_ = fVar166;
  auVar200._20_4_ = fVar166;
  auVar200._24_4_ = fVar166;
  auVar200._28_4_ = fVar166;
  auVar92 = ZEXT1632(CONCAT412(fVar167 * auVar150._12_4_,
                               CONCAT48(fVar167 * auVar150._8_4_,
                                        CONCAT44(fVar167 * auVar150._4_4_,fVar166))));
  auVar100 = vpermps_avx2(auVar203,auVar92);
  auVar92 = vpermps_avx512vl(auVar90,auVar92);
  fVar167 = auVar92._0_4_;
  fVar136 = auVar92._4_4_;
  auVar101._4_4_ = fVar136 * auVar105._4_4_;
  auVar101._0_4_ = fVar167 * auVar105._0_4_;
  fVar147 = auVar92._8_4_;
  auVar101._8_4_ = fVar147 * auVar105._8_4_;
  fVar148 = auVar92._12_4_;
  auVar101._12_4_ = fVar148 * auVar105._12_4_;
  fVar149 = auVar92._16_4_;
  auVar101._16_4_ = fVar149 * auVar105._16_4_;
  fVar176 = auVar92._20_4_;
  auVar101._20_4_ = fVar176 * auVar105._20_4_;
  fVar177 = auVar92._24_4_;
  auVar101._24_4_ = fVar177 * auVar105._24_4_;
  auVar101._28_4_ = 1;
  auVar90._4_4_ = auVar95._4_4_ * fVar136;
  auVar90._0_4_ = auVar95._0_4_ * fVar167;
  auVar90._8_4_ = auVar95._8_4_ * fVar147;
  auVar90._12_4_ = auVar95._12_4_ * fVar148;
  auVar90._16_4_ = auVar95._16_4_ * fVar149;
  auVar90._20_4_ = auVar95._20_4_ * fVar176;
  auVar90._24_4_ = auVar95._24_4_ * fVar177;
  auVar90._28_4_ = auVar105._28_4_;
  auVar95._4_4_ = auVar99._4_4_ * fVar136;
  auVar95._0_4_ = auVar99._0_4_ * fVar167;
  auVar95._8_4_ = auVar99._8_4_ * fVar147;
  auVar95._12_4_ = auVar99._12_4_ * fVar148;
  auVar95._16_4_ = auVar99._16_4_ * fVar149;
  auVar95._20_4_ = auVar99._20_4_ * fVar176;
  auVar95._24_4_ = auVar99._24_4_ * fVar177;
  auVar95._28_4_ = auVar92._28_4_;
  auVar7 = vfmadd231ps_fma(auVar101,auVar100,auVar94);
  auVar8 = vfmadd231ps_fma(auVar90,auVar100,auVar97);
  auVar9 = vfmadd231ps_fma(auVar95,auVar100,auVar103);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar200,auVar96);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar200,auVar104);
  auVar192._8_4_ = 0x7fffffff;
  auVar192._0_8_ = 0x7fffffff7fffffff;
  auVar192._12_4_ = 0x7fffffff;
  auVar192._16_4_ = 0x7fffffff;
  auVar192._20_4_ = 0x7fffffff;
  auVar192._24_4_ = 0x7fffffff;
  auVar192._28_4_ = 0x7fffffff;
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar200,auVar98);
  auVar96 = vandps_avx(ZEXT1632(auVar85),auVar192);
  auVar190._8_4_ = 0x219392ef;
  auVar190._0_8_ = 0x219392ef219392ef;
  auVar190._12_4_ = 0x219392ef;
  auVar190._16_4_ = 0x219392ef;
  auVar190._20_4_ = 0x219392ef;
  auVar190._24_4_ = 0x219392ef;
  auVar190._28_4_ = 0x219392ef;
  uVar79 = vcmpps_avx512vl(auVar96,auVar190,1);
  bVar17 = (bool)((byte)uVar79 & 1);
  auVar91._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar85._0_4_;
  bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar85._4_4_;
  bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar85._8_4_;
  bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar85._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar86),auVar192);
  uVar79 = vcmpps_avx512vl(auVar96,auVar190,1);
  bVar17 = (bool)((byte)uVar79 & 1);
  auVar93._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar86._0_4_;
  bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar86._4_4_;
  bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar86._8_4_;
  bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar86._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar6),auVar192);
  uVar79 = vcmpps_avx512vl(auVar96,auVar190,1);
  bVar17 = (bool)((byte)uVar79 & 1);
  auVar96._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar6._0_4_;
  bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar6._4_4_;
  bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar6._8_4_;
  bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar6._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar94 = vrcp14ps_avx512vl(auVar91);
  auVar191._8_4_ = 0x3f800000;
  auVar191._0_8_ = 0x3f8000003f800000;
  auVar191._12_4_ = 0x3f800000;
  auVar191._16_4_ = 0x3f800000;
  auVar191._20_4_ = 0x3f800000;
  auVar191._24_4_ = 0x3f800000;
  auVar191._28_4_ = 0x3f800000;
  auVar85 = vfnmadd213ps_fma(auVar91,auVar94,auVar191);
  auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar93);
  auVar86 = vfnmadd213ps_fma(auVar93,auVar94,auVar191);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar96);
  auVar6 = vfnmadd213ps_fma(auVar96,auVar94,auVar191);
  auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar94,auVar94);
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 7 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar7));
  auVar98._4_4_ = auVar85._4_4_ * auVar96._4_4_;
  auVar98._0_4_ = auVar85._0_4_ * auVar96._0_4_;
  auVar98._8_4_ = auVar85._8_4_ * auVar96._8_4_;
  auVar98._12_4_ = auVar85._12_4_ * auVar96._12_4_;
  auVar98._16_4_ = auVar96._16_4_ * 0.0;
  auVar98._20_4_ = auVar96._20_4_ * 0.0;
  auVar98._24_4_ = auVar96._24_4_ * 0.0;
  auVar98._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 9 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar7));
  auVar95 = vpbroadcastd_avx512vl();
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar13 * 0x10 + 6));
  auVar163._0_4_ = auVar85._0_4_ * auVar96._0_4_;
  auVar163._4_4_ = auVar85._4_4_ * auVar96._4_4_;
  auVar163._8_4_ = auVar85._8_4_ * auVar96._8_4_;
  auVar163._12_4_ = auVar85._12_4_ * auVar96._12_4_;
  auVar163._16_4_ = auVar96._16_4_ * 0.0;
  auVar163._20_4_ = auVar96._20_4_ * 0.0;
  auVar163._24_4_ = auVar96._24_4_ * 0.0;
  auVar163._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar13 * 0x10 + uVar82 * -2 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar8));
  auVar103._4_4_ = auVar86._4_4_ * auVar96._4_4_;
  auVar103._0_4_ = auVar86._0_4_ * auVar96._0_4_;
  auVar103._8_4_ = auVar86._8_4_ * auVar96._8_4_;
  auVar103._12_4_ = auVar86._12_4_ * auVar96._12_4_;
  auVar103._16_4_ = auVar96._16_4_ * 0.0;
  auVar103._20_4_ = auVar96._20_4_ * 0.0;
  auVar103._24_4_ = auVar96._24_4_ * 0.0;
  auVar103._28_4_ = auVar96._28_4_;
  auVar96 = vcvtdq2ps_avx(auVar94);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar8));
  auVar153._0_4_ = auVar86._0_4_ * auVar96._0_4_;
  auVar153._4_4_ = auVar86._4_4_ * auVar96._4_4_;
  auVar153._8_4_ = auVar86._8_4_ * auVar96._8_4_;
  auVar153._12_4_ = auVar86._12_4_ * auVar96._12_4_;
  auVar153._16_4_ = auVar96._16_4_ * 0.0;
  auVar153._20_4_ = auVar96._20_4_ * 0.0;
  auVar153._24_4_ = auVar96._24_4_ * 0.0;
  auVar153._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 + uVar82 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar9));
  auVar99._4_4_ = auVar96._4_4_ * auVar6._4_4_;
  auVar99._0_4_ = auVar96._0_4_ * auVar6._0_4_;
  auVar99._8_4_ = auVar96._8_4_ * auVar6._8_4_;
  auVar99._12_4_ = auVar96._12_4_ * auVar6._12_4_;
  auVar99._16_4_ = auVar96._16_4_ * 0.0;
  auVar99._20_4_ = auVar96._20_4_ * 0.0;
  auVar99._24_4_ = auVar96._24_4_ * 0.0;
  auVar99._28_4_ = auVar96._28_4_;
  local_468 = prim;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 0x17 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar9));
  auVar138._0_4_ = auVar6._0_4_ * auVar96._0_4_;
  auVar138._4_4_ = auVar6._4_4_ * auVar96._4_4_;
  auVar138._8_4_ = auVar6._8_4_ * auVar96._8_4_;
  auVar138._12_4_ = auVar6._12_4_ * auVar96._12_4_;
  auVar138._16_4_ = auVar96._16_4_ * 0.0;
  auVar138._20_4_ = auVar96._20_4_ * 0.0;
  auVar138._24_4_ = auVar96._24_4_ * 0.0;
  auVar138._28_4_ = 0;
  auVar96 = vpminsd_avx2(auVar98,auVar163);
  auVar94 = vpminsd_avx2(auVar103,auVar153);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94 = vpminsd_avx2(auVar99,auVar138);
  uVar137 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar105._4_4_ = uVar137;
  auVar105._0_4_ = uVar137;
  auVar105._8_4_ = uVar137;
  auVar105._12_4_ = uVar137;
  auVar105._16_4_ = uVar137;
  auVar105._20_4_ = uVar137;
  auVar105._24_4_ = uVar137;
  auVar105._28_4_ = uVar137;
  auVar94 = vmaxps_avx512vl(auVar94,auVar105);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94._8_4_ = 0x3f7ffffa;
  auVar94._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar94._12_4_ = 0x3f7ffffa;
  auVar94._16_4_ = 0x3f7ffffa;
  auVar94._20_4_ = 0x3f7ffffa;
  auVar94._24_4_ = 0x3f7ffffa;
  auVar94._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar96,auVar94);
  auVar96 = vpmaxsd_avx2(auVar98,auVar163);
  auVar94 = vpmaxsd_avx2(auVar103,auVar153);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar94 = vpmaxsd_avx2(auVar99,auVar138);
  fVar167 = (ray->super_RayK<1>).tfar;
  auVar104._4_4_ = fVar167;
  auVar104._0_4_ = fVar167;
  auVar104._8_4_ = fVar167;
  auVar104._12_4_ = fVar167;
  auVar104._16_4_ = fVar167;
  auVar104._20_4_ = fVar167;
  auVar104._24_4_ = fVar167;
  auVar104._28_4_ = fVar167;
  auVar94 = vminps_avx512vl(auVar94,auVar104);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar97._8_4_ = 0x3f800003;
  auVar97._0_8_ = 0x3f8000033f800003;
  auVar97._12_4_ = 0x3f800003;
  auVar97._16_4_ = 0x3f800003;
  auVar97._20_4_ = 0x3f800003;
  auVar97._24_4_ = 0x3f800003;
  auVar97._28_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar97);
  uVar25 = vpcmpgtd_avx512vl(auVar95,_DAT_01fe9900);
  uVar23 = vcmpps_avx512vl(local_80,auVar96,2);
  if ((byte)((byte)uVar23 & (byte)uVar25) != 0) {
    auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar207 = ZEXT1664(auVar85);
    uVar79 = (ulong)(byte)((byte)uVar23 & (byte)uVar25);
    local_538 = context;
    local_540 = ray;
    local_528 = pre;
    do {
      lVar78 = 0;
      for (uVar73 = uVar79; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        lVar78 = lVar78 + 1;
      }
      uVar80 = *(uint *)(local_468 + 2);
      uVar76 = *(uint *)(local_468 + lVar78 * 4 + 6);
      local_548 = (ulong)uVar80;
      pGVar15 = (context->scene->geometries).items[uVar80].ptr;
      local_530 = (ulong)uVar76;
      uVar73 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                               (ulong)uVar76 *
                               pGVar15[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar74 = (long)pGVar15[1].intersectionFilterN * uVar73;
      lVar78 = *(long *)&pGVar15[1].time_range.upper;
      local_4d0 = *(undefined1 (*) [16])(lVar78 + lVar74);
      lVar77 = (long)pGVar15[1].intersectionFilterN * (uVar73 + 1);
      _local_4e0 = *(undefined1 (*) [16])(lVar78 + lVar77);
      iVar14 = (int)pGVar15[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar71 = (long)iVar14 * 0x44;
      auVar150._8_4_ = 0xbeaaaaab;
      auVar150._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar150._12_4_ = 0xbeaaaaab;
      local_4c0 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                    (pGVar15[2].intersectionFilterN +
                                    uVar73 * (long)pGVar15[2].pointQueryFunc),local_4d0,auVar150);
      local_4f0 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                   (pGVar15[2].intersectionFilterN +
                                   (long)pGVar15[2].pointQueryFunc * (uVar73 + 1)),_local_4e0,
                                  auVar150);
      aVar3 = (ray->super_RayK<1>).org.field_0;
      auVar161 = local_4d0;
      auVar86 = vsubps_avx(local_4d0,(undefined1  [16])aVar3);
      uVar137 = auVar86._0_4_;
      auVar151._4_4_ = uVar137;
      auVar151._0_4_ = uVar137;
      auVar151._8_4_ = uVar137;
      auVar151._12_4_ = uVar137;
      auVar85 = vshufps_avx(auVar86,auVar86,0x55);
      aVar4 = (pre->ray_space).vx.field_0;
      aVar5 = (pre->ray_space).vy.field_0;
      auVar86 = vshufps_avx(auVar86,auVar86,0xaa);
      fVar167 = (pre->ray_space).vz.field_0.m128[0];
      fVar136 = (pre->ray_space).vz.field_0.m128[1];
      fVar147 = (pre->ray_space).vz.field_0.m128[2];
      fVar148 = (pre->ray_space).vz.field_0.m128[3];
      auVar197._0_4_ = auVar86._0_4_ * fVar167;
      auVar197._4_4_ = auVar86._4_4_ * fVar136;
      auVar197._8_4_ = auVar86._8_4_ * fVar147;
      auVar197._12_4_ = auVar86._12_4_ * fVar148;
      auVar85 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar5,auVar85);
      auVar6 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar151);
      auVar86 = vsubps_avx(local_4c0,(undefined1  [16])aVar3);
      uVar137 = auVar86._0_4_;
      auVar152._4_4_ = uVar137;
      auVar152._0_4_ = uVar137;
      auVar152._8_4_ = uVar137;
      auVar152._12_4_ = uVar137;
      auVar85 = vshufps_avx(auVar86,auVar86,0x55);
      auVar86 = vshufps_avx(auVar86,auVar86,0xaa);
      auVar198._0_4_ = auVar86._0_4_ * fVar167;
      auVar198._4_4_ = auVar86._4_4_ * fVar136;
      auVar198._8_4_ = auVar86._8_4_ * fVar147;
      auVar198._12_4_ = auVar86._12_4_ * fVar148;
      auVar85 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar5,auVar85);
      auVar7 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar152);
      auVar86 = vsubps_avx(local_4f0,(undefined1  [16])aVar3);
      uVar137 = auVar86._0_4_;
      auVar89._4_4_ = uVar137;
      auVar89._0_4_ = uVar137;
      auVar89._8_4_ = uVar137;
      auVar89._12_4_ = uVar137;
      auVar85 = vshufps_avx(auVar86,auVar86,0x55);
      auVar86 = vshufps_avx(auVar86,auVar86,0xaa);
      auVar88._0_4_ = auVar86._0_4_ * fVar167;
      auVar88._4_4_ = auVar86._4_4_ * fVar136;
      auVar88._8_4_ = auVar86._8_4_ * fVar147;
      auVar88._12_4_ = auVar86._12_4_ * fVar148;
      auVar85 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar85);
      auVar8 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar89);
      auVar152 = _local_4e0;
      local_3e0 = ZEXT1632((undefined1  [16])aVar3);
      auVar86 = vsubps_avx(_local_4e0,(undefined1  [16])aVar3);
      uVar137 = auVar86._0_4_;
      auVar87._4_4_ = uVar137;
      auVar87._0_4_ = uVar137;
      auVar87._8_4_ = uVar137;
      auVar87._12_4_ = uVar137;
      auVar85 = vshufps_avx(auVar86,auVar86,0x55);
      auVar86 = vshufps_avx(auVar86,auVar86,0xaa);
      auVar202._0_4_ = auVar86._0_4_ * fVar167;
      auVar202._4_4_ = auVar86._4_4_ * fVar136;
      auVar202._8_4_ = auVar86._8_4_ * fVar147;
      auVar202._12_4_ = auVar86._12_4_ * fVar148;
      auVar85 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar5,auVar85);
      auVar9 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar87);
      auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar71);
      uVar137 = auVar6._0_4_;
      local_2e0._4_4_ = uVar137;
      local_2e0._0_4_ = uVar137;
      local_2e0._8_4_ = uVar137;
      local_2e0._12_4_ = uVar137;
      local_2e0._16_4_ = uVar137;
      local_2e0._20_4_ = uVar137;
      local_2e0._24_4_ = uVar137;
      local_2e0._28_4_ = uVar137;
      auVar139._8_4_ = 1;
      auVar139._0_8_ = 0x100000001;
      auVar139._12_4_ = 1;
      auVar139._16_4_ = 1;
      auVar139._20_4_ = 1;
      auVar139._24_4_ = 1;
      auVar139._28_4_ = 1;
      local_300 = vpermps_avx2(auVar139,ZEXT1632(auVar6));
      auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar71 + 0x484);
      local_320 = vbroadcastss_avx512vl(auVar7);
      auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar71 + 0x908);
      local_340 = vpermps_avx512vl(auVar139,ZEXT1632(auVar7));
      local_360 = vbroadcastss_avx512vl(auVar8);
      local_380 = vpermps_avx512vl(auVar139,ZEXT1632(auVar8));
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar71 + 0xd8c);
      uVar137 = auVar9._0_4_;
      local_3a0._4_4_ = uVar137;
      local_3a0._0_4_ = uVar137;
      fStack_398 = (float)uVar137;
      fStack_394 = (float)uVar137;
      fStack_390 = (float)uVar137;
      fStack_38c = (float)uVar137;
      fStack_388 = (float)uVar137;
      register0x0000139c = uVar137;
      _local_3c0 = vpermps_avx512vl(auVar139,ZEXT1632(auVar9));
      auVar97 = vmulps_avx512vl(_local_3a0,auVar104);
      auVar95 = vmulps_avx512vl(_local_3c0,auVar104);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar105,local_360);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar105,local_380);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,local_320);
      auVar98 = vfmadd231ps_avx512vl(auVar95,auVar94,local_340);
      auVar10 = vfmadd231ps_fma(auVar97,auVar96,local_2e0);
      auVar188 = ZEXT1664(auVar10);
      auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar71);
      auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar71 + 0x484);
      auVar11 = vfmadd231ps_fma(auVar98,auVar96,local_300);
      auVar183 = ZEXT1664(auVar11);
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar71 + 0x908);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar71 + 0xd8c);
      auVar99 = vmulps_avx512vl(_local_3a0,auVar103);
      auVar100 = vmulps_avx512vl(_local_3c0,auVar103);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar98,local_360);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar98,local_380);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar95,local_320);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar95,local_340);
      auVar12 = vfmadd231ps_fma(auVar99,auVar97,local_2e0);
      auVar193 = ZEXT1664(auVar12);
      auVar150 = vfmadd231ps_fma(auVar100,auVar97,local_300);
      auVar99 = vsubps_avx512vl(ZEXT1632(auVar12),ZEXT1632(auVar10));
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar150),ZEXT1632(auVar11));
      auVar92 = vmulps_avx512vl(ZEXT1632(auVar11),auVar99);
      auVar101 = vmulps_avx512vl(ZEXT1632(auVar10),auVar100);
      auVar92 = vsubps_avx512vl(auVar92,auVar101);
      auVar85 = vshufps_avx(local_4c0,local_4c0,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar85);
      auVar85 = vshufps_avx(local_4f0,local_4f0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar85);
      local_e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar78 + 0xc + lVar77)));
      auVar101 = vmulps_avx512vl(local_e0,auVar104);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar105,local_c0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar94,local_a0);
      local_100 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar78 + 0xc + lVar74)));
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,local_100);
      auVar102 = vmulps_avx512vl(local_e0,auVar103);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,local_c0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar95,local_a0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar97,local_100);
      auVar90 = vmulps_avx512vl(auVar100,auVar100);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar99,auVar99);
      auVar91 = vmaxps_avx512vl(auVar101,auVar102);
      auVar91 = vmulps_avx512vl(auVar91,auVar91);
      auVar90 = vmulps_avx512vl(auVar91,auVar90);
      auVar92 = vmulps_avx512vl(auVar92,auVar92);
      uVar23 = vcmpps_avx512vl(auVar92,auVar90,2);
      auVar85 = vinsertps_avx512f(auVar6,local_100._0_16_,0x30);
      auVar197 = auVar207._0_16_;
      auVar86 = vandps_avx512vl(auVar85,auVar197);
      auVar89 = local_4c0;
      auVar85 = vblendps_avx(auVar7,local_4c0,8);
      auVar85 = vandps_avx512vl(auVar85,auVar197);
      auVar86 = vmaxps_avx512vl(auVar86,auVar85);
      auVar151 = local_4f0;
      auVar85 = vblendps_avx(auVar8,local_4f0,8);
      auVar87 = vandps_avx512vl(auVar85,auVar197);
      auVar85 = vinsertps_avx512f(auVar9,local_e0._0_16_,0x30);
      auVar85 = vandps_avx512vl(auVar85,auVar197);
      auVar85 = vmaxps_avx512vl(auVar87,auVar85);
      auVar85 = vmaxps_avx(auVar86,auVar85);
      auVar86 = vmovshdup_avx(auVar85);
      auVar86 = vmaxss_avx(auVar86,auVar85);
      auVar85 = vshufpd_avx(auVar85,auVar85,1);
      auVar85 = vmaxss_avx(auVar85,auVar86);
      local_4b0 = vcvtsi2ss_avx512f(in_ZMM25._0_16_,iVar14);
      auVar195._0_4_ = local_4b0._0_4_;
      auVar195._4_4_ = auVar195._0_4_;
      auVar195._8_4_ = auVar195._0_4_;
      auVar195._12_4_ = auVar195._0_4_;
      auVar195._16_4_ = auVar195._0_4_;
      auVar195._20_4_ = auVar195._0_4_;
      auVar195._24_4_ = auVar195._0_4_;
      auVar195._28_4_ = auVar195._0_4_;
      uVar25 = vcmpps_avx512vl(auVar195,_DAT_01faff40,0xe);
      bVar81 = (byte)uVar23 & (byte)uVar25;
      fVar167 = auVar85._0_4_ * 4.7683716e-07;
      local_440._0_16_ = ZEXT416((uint)fVar167);
      auVar92 = auVar205._0_32_;
      local_420 = vpermps_avx512vl(auVar92,ZEXT1632(auVar6));
      auVar206 = ZEXT3264(local_420);
      local_160 = vpermps_avx512vl(auVar92,ZEXT1632(auVar7));
      local_180 = vpermps_avx512vl(auVar92,ZEXT1632(auVar8));
      local_1a0 = vpermps_avx512vl(auVar92,ZEXT1632(auVar9));
      local_4f0 = auVar151;
      _local_4e0 = auVar152;
      local_4d0 = auVar161;
      local_4c0 = auVar89;
      if (bVar81 != 0) {
        in_ZMM25 = ZEXT3264(local_1a0);
        auVar103 = vmulps_avx512vl(local_1a0,auVar103);
        auVar98 = vfmadd213ps_avx512vl(auVar98,local_180,auVar103);
        auVar95 = vfmadd213ps_avx512vl(auVar95,local_160,auVar98);
        auVar95 = vfmadd213ps_avx512vl(auVar97,local_420,auVar95);
        auVar104 = vmulps_avx512vl(local_1a0,auVar104);
        auVar105 = vfmadd213ps_avx512vl(auVar105,local_180,auVar104);
        auVar98 = vfmadd213ps_avx512vl(auVar94,local_160,auVar105);
        auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar71 + 0x1210);
        auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar71 + 0x1694);
        auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar71 + 0x1b18);
        auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar71 + 0x1f9c);
        auVar98 = vfmadd213ps_avx512vl(auVar96,local_420,auVar98);
        auVar96 = vmulps_avx512vl(_local_3a0,auVar97);
        auVar103 = vmulps_avx512vl(_local_3c0,auVar97);
        auVar97 = vmulps_avx512vl(local_1a0,auVar97);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar104,local_360);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar104,local_380);
        auVar104 = vfmadd231ps_avx512vl(auVar97,local_180,auVar104);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar105,local_320);
        auVar97 = vfmadd231ps_avx512vl(auVar103,auVar105,local_340);
        auVar103 = vfmadd231ps_avx512vl(auVar104,local_160,auVar105);
        auVar92 = vfmadd231ps_avx512vl(auVar96,auVar94,local_2e0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,local_300);
        auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar71 + 0x1210);
        auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar71 + 0x1b18);
        auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar71 + 0x1f9c);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_420,auVar94);
        auVar94 = vmulps_avx512vl(_local_3a0,auVar104);
        auVar90 = vmulps_avx512vl(_local_3c0,auVar104);
        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar207 = ZEXT1664(auVar85);
        auVar104 = vmulps_avx512vl(local_1a0,auVar104);
        auVar91 = vfmadd231ps_avx512vl(auVar94,auVar105,local_360);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar105,local_380);
        auVar105 = vfmadd231ps_avx512vl(auVar104,local_180,auVar105);
        auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar71 + 0x1694);
        auVar104 = vfmadd231ps_avx512vl(auVar91,auVar94,local_320);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar94,local_340);
        auVar94 = vfmadd231ps_avx512vl(auVar105,local_160,auVar94);
        auVar105 = vfmadd231ps_avx512vl(auVar104,auVar96,local_2e0);
        auVar104 = vfmadd231ps_avx512vl(auVar90,auVar96,local_300);
        auVar94 = vfmadd231ps_avx512vl(auVar94,local_420,auVar96);
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar92,auVar90);
        vandps_avx512vl(auVar97,auVar90);
        auVar96 = vmaxps_avx(auVar90,auVar90);
        vandps_avx512vl(auVar103,auVar90);
        auVar96 = vmaxps_avx(auVar96,auVar90);
        auVar201._4_4_ = fVar167;
        auVar201._0_4_ = fVar167;
        auVar201._8_4_ = fVar167;
        auVar201._12_4_ = fVar167;
        auVar201._16_4_ = fVar167;
        auVar201._20_4_ = fVar167;
        auVar201._24_4_ = fVar167;
        auVar201._28_4_ = fVar167;
        uVar73 = vcmpps_avx512vl(auVar96,auVar201,1);
        bVar17 = (bool)((byte)uVar73 & 1);
        auVar106._0_4_ = (float)((uint)bVar17 * auVar99._0_4_ | (uint)!bVar17 * auVar92._0_4_);
        bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar17 * auVar99._4_4_ | (uint)!bVar17 * auVar92._4_4_);
        bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar17 * auVar99._8_4_ | (uint)!bVar17 * auVar92._8_4_);
        bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar17 * auVar99._12_4_ | (uint)!bVar17 * auVar92._12_4_);
        bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar106._16_4_ = (float)((uint)bVar17 * auVar99._16_4_ | (uint)!bVar17 * auVar92._16_4_);
        bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar106._20_4_ = (float)((uint)bVar17 * auVar99._20_4_ | (uint)!bVar17 * auVar92._20_4_);
        bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar106._24_4_ = (float)((uint)bVar17 * auVar99._24_4_ | (uint)!bVar17 * auVar92._24_4_);
        bVar17 = SUB81(uVar73 >> 7,0);
        auVar106._28_4_ = (uint)bVar17 * auVar99._28_4_ | (uint)!bVar17 * auVar92._28_4_;
        bVar17 = (bool)((byte)uVar73 & 1);
        auVar107._0_4_ = (float)((uint)bVar17 * auVar100._0_4_ | (uint)!bVar17 * auVar97._0_4_);
        bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar17 * auVar100._4_4_ | (uint)!bVar17 * auVar97._4_4_);
        bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar17 * auVar100._8_4_ | (uint)!bVar17 * auVar97._8_4_);
        bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar17 * auVar100._12_4_ | (uint)!bVar17 * auVar97._12_4_);
        bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar17 * auVar100._16_4_ | (uint)!bVar17 * auVar97._16_4_);
        bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar17 * auVar100._20_4_ | (uint)!bVar17 * auVar97._20_4_);
        bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar17 * auVar100._24_4_ | (uint)!bVar17 * auVar97._24_4_);
        bVar17 = SUB81(uVar73 >> 7,0);
        auVar107._28_4_ = (uint)bVar17 * auVar100._28_4_ | (uint)!bVar17 * auVar97._28_4_;
        vandps_avx512vl(auVar105,auVar90);
        vandps_avx512vl(auVar104,auVar90);
        auVar96 = vmaxps_avx(auVar107,auVar107);
        vandps_avx512vl(auVar94,auVar90);
        auVar96 = vmaxps_avx(auVar96,auVar107);
        uVar73 = vcmpps_avx512vl(auVar96,auVar201,1);
        bVar17 = (bool)((byte)uVar73 & 1);
        auVar108._0_4_ = (float)((uint)bVar17 * auVar99._0_4_ | (uint)!bVar17 * auVar105._0_4_);
        bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar17 * auVar99._4_4_ | (uint)!bVar17 * auVar105._4_4_);
        bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar17 * auVar99._8_4_ | (uint)!bVar17 * auVar105._8_4_);
        bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar17 * auVar99._12_4_ | (uint)!bVar17 * auVar105._12_4_);
        bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar108._16_4_ = (float)((uint)bVar17 * auVar99._16_4_ | (uint)!bVar17 * auVar105._16_4_);
        bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar108._20_4_ = (float)((uint)bVar17 * auVar99._20_4_ | (uint)!bVar17 * auVar105._20_4_);
        bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar108._24_4_ = (float)((uint)bVar17 * auVar99._24_4_ | (uint)!bVar17 * auVar105._24_4_);
        bVar17 = SUB81(uVar73 >> 7,0);
        auVar108._28_4_ = (uint)bVar17 * auVar99._28_4_ | (uint)!bVar17 * auVar105._28_4_;
        bVar17 = (bool)((byte)uVar73 & 1);
        auVar109._0_4_ = (float)((uint)bVar17 * auVar100._0_4_ | (uint)!bVar17 * auVar104._0_4_);
        bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar17 * auVar100._4_4_ | (uint)!bVar17 * auVar104._4_4_);
        bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar17 * auVar100._8_4_ | (uint)!bVar17 * auVar104._8_4_);
        bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar17 * auVar100._12_4_ | (uint)!bVar17 * auVar104._12_4_);
        bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar109._16_4_ = (float)((uint)bVar17 * auVar100._16_4_ | (uint)!bVar17 * auVar104._16_4_);
        bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar109._20_4_ = (float)((uint)bVar17 * auVar100._20_4_ | (uint)!bVar17 * auVar104._20_4_);
        bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar109._24_4_ = (float)((uint)bVar17 * auVar100._24_4_ | (uint)!bVar17 * auVar104._24_4_);
        bVar17 = SUB81(uVar73 >> 7,0);
        auVar109._28_4_ = (uint)bVar17 * auVar100._28_4_ | (uint)!bVar17 * auVar104._28_4_;
        auVar88 = vxorps_avx512vl(local_320._0_16_,local_320._0_16_);
        auVar96 = vfmadd213ps_avx512vl(auVar106,auVar106,ZEXT1632(auVar88));
        auVar85 = vfmadd231ps_fma(auVar96,auVar107,auVar107);
        auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar85));
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0xbf000000));
        auVar104 = vmulps_avx512vl(ZEXT1632(auVar85),auVar105);
        fVar167 = auVar96._0_4_;
        fVar136 = auVar96._4_4_;
        fVar147 = auVar96._8_4_;
        fVar148 = auVar96._12_4_;
        fVar149 = auVar96._16_4_;
        fVar176 = auVar96._20_4_;
        fVar177 = auVar96._24_4_;
        auVar38._4_4_ = fVar136 * fVar136 * fVar136 * auVar104._4_4_;
        auVar38._0_4_ = fVar167 * fVar167 * fVar167 * auVar104._0_4_;
        auVar38._8_4_ = fVar147 * fVar147 * fVar147 * auVar104._8_4_;
        auVar38._12_4_ = fVar148 * fVar148 * fVar148 * auVar104._12_4_;
        auVar38._16_4_ = fVar149 * fVar149 * fVar149 * auVar104._16_4_;
        auVar38._20_4_ = fVar176 * fVar176 * fVar176 * auVar104._20_4_;
        auVar38._24_4_ = fVar177 * fVar177 * fVar177 * auVar104._24_4_;
        auVar38._28_4_ = auVar94._28_4_;
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar96 = vfmadd231ps_avx512vl(auVar38,auVar94,auVar96);
        auVar39._4_4_ = auVar107._4_4_ * auVar96._4_4_;
        auVar39._0_4_ = auVar107._0_4_ * auVar96._0_4_;
        auVar39._8_4_ = auVar107._8_4_ * auVar96._8_4_;
        auVar39._12_4_ = auVar107._12_4_ * auVar96._12_4_;
        auVar39._16_4_ = auVar107._16_4_ * auVar96._16_4_;
        auVar39._20_4_ = auVar107._20_4_ * auVar96._20_4_;
        auVar39._24_4_ = auVar107._24_4_ * auVar96._24_4_;
        auVar39._28_4_ = auVar104._28_4_;
        auVar40._4_4_ = auVar96._4_4_ * -auVar106._4_4_;
        auVar40._0_4_ = auVar96._0_4_ * -auVar106._0_4_;
        auVar40._8_4_ = auVar96._8_4_ * -auVar106._8_4_;
        auVar40._12_4_ = auVar96._12_4_ * -auVar106._12_4_;
        auVar40._16_4_ = auVar96._16_4_ * -auVar106._16_4_;
        auVar40._20_4_ = auVar96._20_4_ * -auVar106._20_4_;
        auVar40._24_4_ = auVar96._24_4_ * -auVar106._24_4_;
        auVar40._28_4_ = auVar107._28_4_;
        auVar104 = vmulps_avx512vl(auVar96,ZEXT1632(auVar88));
        auVar103 = ZEXT1632(auVar88);
        auVar97 = vfmadd213ps_avx512vl(auVar108,auVar108,auVar103);
        auVar85 = vfmadd231ps_fma(auVar97,auVar109,auVar109);
        auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar85));
        auVar105 = vmulps_avx512vl(ZEXT1632(auVar85),auVar105);
        fVar167 = auVar97._0_4_;
        fVar136 = auVar97._4_4_;
        fVar147 = auVar97._8_4_;
        fVar148 = auVar97._12_4_;
        fVar149 = auVar97._16_4_;
        fVar176 = auVar97._20_4_;
        fVar177 = auVar97._24_4_;
        auVar41._4_4_ = fVar136 * fVar136 * fVar136 * auVar105._4_4_;
        auVar41._0_4_ = fVar167 * fVar167 * fVar167 * auVar105._0_4_;
        auVar41._8_4_ = fVar147 * fVar147 * fVar147 * auVar105._8_4_;
        auVar41._12_4_ = fVar148 * fVar148 * fVar148 * auVar105._12_4_;
        auVar41._16_4_ = fVar149 * fVar149 * fVar149 * auVar105._16_4_;
        auVar41._20_4_ = fVar176 * fVar176 * fVar176 * auVar105._20_4_;
        auVar41._24_4_ = fVar177 * fVar177 * fVar177 * auVar105._24_4_;
        auVar41._28_4_ = auVar96._28_4_;
        auVar96 = vfmadd231ps_avx512vl(auVar41,auVar94,auVar97);
        auVar42._4_4_ = auVar109._4_4_ * auVar96._4_4_;
        auVar42._0_4_ = auVar109._0_4_ * auVar96._0_4_;
        auVar42._8_4_ = auVar109._8_4_ * auVar96._8_4_;
        auVar42._12_4_ = auVar109._12_4_ * auVar96._12_4_;
        auVar42._16_4_ = auVar109._16_4_ * auVar96._16_4_;
        auVar42._20_4_ = auVar109._20_4_ * auVar96._20_4_;
        auVar42._24_4_ = auVar109._24_4_ * auVar96._24_4_;
        auVar42._28_4_ = auVar105._28_4_;
        auVar43._4_4_ = auVar96._4_4_ * -auVar108._4_4_;
        auVar43._0_4_ = auVar96._0_4_ * -auVar108._0_4_;
        auVar43._8_4_ = auVar96._8_4_ * -auVar108._8_4_;
        auVar43._12_4_ = auVar96._12_4_ * -auVar108._12_4_;
        auVar43._16_4_ = auVar96._16_4_ * -auVar108._16_4_;
        auVar43._20_4_ = auVar96._20_4_ * -auVar108._20_4_;
        auVar43._24_4_ = auVar96._24_4_ * -auVar108._24_4_;
        auVar43._28_4_ = auVar97._28_4_;
        auVar96 = vmulps_avx512vl(auVar96,auVar103);
        auVar85 = vfmadd213ps_fma(auVar39,auVar101,ZEXT1632(auVar10));
        auVar86 = vfmadd213ps_fma(auVar40,auVar101,ZEXT1632(auVar11));
        auVar105 = vfmadd213ps_avx512vl(auVar104,auVar101,auVar98);
        auVar97 = vfmadd213ps_avx512vl(auVar42,auVar102,ZEXT1632(auVar12));
        auVar87 = vfnmadd213ps_fma(auVar39,auVar101,ZEXT1632(auVar10));
        auVar6 = vfmadd213ps_fma(auVar43,auVar102,ZEXT1632(auVar150));
        auVar11 = vfnmadd213ps_fma(auVar40,auVar101,ZEXT1632(auVar11));
        auVar7 = vfmadd213ps_fma(auVar96,auVar102,auVar95);
        auVar197 = vfnmadd231ps_fma(auVar98,auVar101,auVar104);
        auVar12 = vfnmadd213ps_fma(auVar42,auVar102,ZEXT1632(auVar12));
        auVar150 = vfnmadd213ps_fma(auVar43,auVar102,ZEXT1632(auVar150));
        auVar198 = vfnmadd231ps_fma(auVar95,auVar102,auVar96);
        auVar95 = vsubps_avx512vl(auVar97,ZEXT1632(auVar87));
        auVar96 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar11));
        auVar94 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar197));
        auVar44._4_4_ = auVar96._4_4_ * auVar197._4_4_;
        auVar44._0_4_ = auVar96._0_4_ * auVar197._0_4_;
        auVar44._8_4_ = auVar96._8_4_ * auVar197._8_4_;
        auVar44._12_4_ = auVar96._12_4_ * auVar197._12_4_;
        auVar44._16_4_ = auVar96._16_4_ * 0.0;
        auVar44._20_4_ = auVar96._20_4_ * 0.0;
        auVar44._24_4_ = auVar96._24_4_ * 0.0;
        auVar44._28_4_ = auVar104._28_4_;
        auVar8 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar11),auVar94);
        auVar45._4_4_ = auVar94._4_4_ * auVar87._4_4_;
        auVar45._0_4_ = auVar94._0_4_ * auVar87._0_4_;
        auVar45._8_4_ = auVar94._8_4_ * auVar87._8_4_;
        auVar45._12_4_ = auVar94._12_4_ * auVar87._12_4_;
        auVar45._16_4_ = auVar94._16_4_ * 0.0;
        auVar45._20_4_ = auVar94._20_4_ * 0.0;
        auVar45._24_4_ = auVar94._24_4_ * 0.0;
        auVar45._28_4_ = auVar94._28_4_;
        auVar9 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar197),auVar95);
        auVar46._4_4_ = auVar11._4_4_ * auVar95._4_4_;
        auVar46._0_4_ = auVar11._0_4_ * auVar95._0_4_;
        auVar46._8_4_ = auVar11._8_4_ * auVar95._8_4_;
        auVar46._12_4_ = auVar11._12_4_ * auVar95._12_4_;
        auVar46._16_4_ = auVar95._16_4_ * 0.0;
        auVar46._20_4_ = auVar95._20_4_ * 0.0;
        auVar46._24_4_ = auVar95._24_4_ * 0.0;
        auVar46._28_4_ = auVar95._28_4_;
        auVar10 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar87),auVar96);
        auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar103,ZEXT1632(auVar9));
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar103,ZEXT1632(auVar8));
        auVar90 = ZEXT1632(auVar88);
        uVar73 = vcmpps_avx512vl(auVar96,auVar90,2);
        bVar72 = (byte)uVar73;
        fVar83 = (float)((uint)(bVar72 & 1) * auVar85._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar12._0_4_);
        bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
        fVar130 = (float)((uint)bVar17 * auVar85._4_4_ | (uint)!bVar17 * auVar12._4_4_);
        bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
        fVar132 = (float)((uint)bVar17 * auVar85._8_4_ | (uint)!bVar17 * auVar12._8_4_);
        bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
        fVar134 = (float)((uint)bVar17 * auVar85._12_4_ | (uint)!bVar17 * auVar12._12_4_);
        auVar98 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar132,CONCAT44(fVar130,fVar83))));
        fVar84 = (float)((uint)(bVar72 & 1) * auVar86._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar150._0_4_);
        bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
        fVar131 = (float)((uint)bVar17 * auVar86._4_4_ | (uint)!bVar17 * auVar150._4_4_);
        bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
        fVar133 = (float)((uint)bVar17 * auVar86._8_4_ | (uint)!bVar17 * auVar150._8_4_);
        bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
        fVar135 = (float)((uint)bVar17 * auVar86._12_4_ | (uint)!bVar17 * auVar150._12_4_);
        auVar103 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar133,CONCAT44(fVar131,fVar84))));
        auVar110._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar105._0_4_ |
                    (uint)!(bool)(bVar72 & 1) * auVar198._0_4_);
        bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar17 * auVar105._4_4_ | (uint)!bVar17 * auVar198._4_4_);
        bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar17 * auVar105._8_4_ | (uint)!bVar17 * auVar198._8_4_);
        bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar17 * auVar105._12_4_ | (uint)!bVar17 * auVar198._12_4_);
        fVar167 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar105._16_4_);
        auVar110._16_4_ = fVar167;
        fVar136 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar105._20_4_);
        auVar110._20_4_ = fVar136;
        fVar147 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar105._24_4_);
        auVar110._24_4_ = fVar147;
        iVar1 = (uint)(byte)(uVar73 >> 7) * auVar105._28_4_;
        auVar110._28_4_ = iVar1;
        auVar96 = vblendmps_avx512vl(ZEXT1632(auVar87),auVar97);
        auVar111._0_4_ =
             (uint)(bVar72 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar85._0_4_;
        bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar111._4_4_ = (uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar85._4_4_;
        bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar111._8_4_ = (uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar85._8_4_;
        bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar111._12_4_ = (uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar85._12_4_;
        auVar111._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar96._16_4_;
        auVar111._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar96._20_4_;
        auVar111._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar96._24_4_;
        auVar111._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar96._28_4_;
        auVar96 = vblendmps_avx512vl(ZEXT1632(auVar11),ZEXT1632(auVar6));
        auVar112._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar8._0_4_);
        bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar8._4_4_);
        bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar8._8_4_);
        bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar8._12_4_);
        fVar148 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar96._16_4_);
        auVar112._16_4_ = fVar148;
        fVar149 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar96._20_4_);
        auVar112._20_4_ = fVar149;
        fVar176 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar96._24_4_);
        auVar112._24_4_ = fVar176;
        auVar112._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar96._28_4_;
        auVar96 = vblendmps_avx512vl(ZEXT1632(auVar197),ZEXT1632(auVar7));
        auVar113._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar86._0_4_)
        ;
        bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar86._4_4_);
        bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar86._8_4_);
        bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar86._12_4_);
        fVar178 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar96._16_4_);
        auVar113._16_4_ = fVar178;
        fVar177 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar96._20_4_);
        auVar113._20_4_ = fVar177;
        fVar166 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar96._24_4_);
        auVar113._24_4_ = fVar166;
        iVar2 = (uint)(byte)(uVar73 >> 7) * auVar96._28_4_;
        auVar113._28_4_ = iVar2;
        auVar114._0_4_ =
             (uint)(bVar72 & 1) * (int)auVar87._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar97._0_4_;
        bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar17 * (int)auVar87._4_4_ | (uint)!bVar17 * auVar97._4_4_;
        bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar17 * (int)auVar87._8_4_ | (uint)!bVar17 * auVar97._8_4_;
        bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar17 * (int)auVar87._12_4_ | (uint)!bVar17 * auVar97._12_4_;
        auVar114._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar97._16_4_;
        auVar114._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar97._20_4_;
        auVar114._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar97._24_4_;
        auVar114._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar97._28_4_;
        bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar73 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar73 >> 3) & 1);
        bVar18 = (bool)((byte)(uVar73 >> 1) & 1);
        bVar20 = (bool)((byte)(uVar73 >> 2) & 1);
        bVar22 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar99 = vsubps_avx512vl(auVar114,auVar98);
        auVar94 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar11._12_4_ |
                                                (uint)!bVar21 * auVar6._12_4_,
                                                CONCAT48((uint)bVar19 * (int)auVar11._8_4_ |
                                                         (uint)!bVar19 * auVar6._8_4_,
                                                         CONCAT44((uint)bVar17 * (int)auVar11._4_4_
                                                                  | (uint)!bVar17 * auVar6._4_4_,
                                                                  (uint)(bVar72 & 1) *
                                                                  (int)auVar11._0_4_ |
                                                                  (uint)!(bool)(bVar72 & 1) *
                                                                  auVar6._0_4_)))),auVar103);
        auVar188 = ZEXT3264(auVar94);
        auVar105 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar197._12_4_ |
                                                 (uint)!bVar22 * auVar7._12_4_,
                                                 CONCAT48((uint)bVar20 * (int)auVar197._8_4_ |
                                                          (uint)!bVar20 * auVar7._8_4_,
                                                          CONCAT44((uint)bVar18 *
                                                                   (int)auVar197._4_4_ |
                                                                   (uint)!bVar18 * auVar7._4_4_,
                                                                   (uint)(bVar72 & 1) *
                                                                   (int)auVar197._0_4_ |
                                                                   (uint)!(bool)(bVar72 & 1) *
                                                                   auVar7._0_4_)))),auVar110);
        auVar104 = vsubps_avx(auVar98,auVar111);
        auVar193 = ZEXT3264(auVar104);
        auVar97 = vsubps_avx(auVar103,auVar112);
        auVar95 = vsubps_avx(auVar110,auVar113);
        auVar47._4_4_ = auVar105._4_4_ * fVar130;
        auVar47._0_4_ = auVar105._0_4_ * fVar83;
        auVar47._8_4_ = auVar105._8_4_ * fVar132;
        auVar47._12_4_ = auVar105._12_4_ * fVar134;
        auVar47._16_4_ = auVar105._16_4_ * 0.0;
        auVar47._20_4_ = auVar105._20_4_ * 0.0;
        auVar47._24_4_ = auVar105._24_4_ * 0.0;
        auVar47._28_4_ = 0;
        auVar85 = vfmsub231ps_fma(auVar47,auVar110,auVar99);
        auVar172._0_4_ = fVar84 * auVar99._0_4_;
        auVar172._4_4_ = fVar131 * auVar99._4_4_;
        auVar172._8_4_ = fVar133 * auVar99._8_4_;
        auVar172._12_4_ = fVar135 * auVar99._12_4_;
        auVar172._16_4_ = auVar99._16_4_ * 0.0;
        auVar172._20_4_ = auVar99._20_4_ * 0.0;
        auVar172._24_4_ = auVar99._24_4_ * 0.0;
        auVar172._28_4_ = 0;
        auVar86 = vfmsub231ps_fma(auVar172,auVar98,auVar94);
        auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar90,ZEXT1632(auVar85));
        auVar179._0_4_ = auVar94._0_4_ * auVar110._0_4_;
        auVar179._4_4_ = auVar94._4_4_ * auVar110._4_4_;
        auVar179._8_4_ = auVar94._8_4_ * auVar110._8_4_;
        auVar179._12_4_ = auVar94._12_4_ * auVar110._12_4_;
        auVar179._16_4_ = auVar94._16_4_ * fVar167;
        auVar179._20_4_ = auVar94._20_4_ * fVar136;
        auVar179._24_4_ = auVar94._24_4_ * fVar147;
        auVar179._28_4_ = 0;
        auVar85 = vfmsub231ps_fma(auVar179,auVar103,auVar105);
        auVar100 = vfmadd231ps_avx512vl(auVar96,auVar90,ZEXT1632(auVar85));
        auVar96 = vmulps_avx512vl(auVar95,auVar111);
        auVar96 = vfmsub231ps_avx512vl(auVar96,auVar104,auVar113);
        auVar48._4_4_ = auVar97._4_4_ * auVar113._4_4_;
        auVar48._0_4_ = auVar97._0_4_ * auVar113._0_4_;
        auVar48._8_4_ = auVar97._8_4_ * auVar113._8_4_;
        auVar48._12_4_ = auVar97._12_4_ * auVar113._12_4_;
        auVar48._16_4_ = auVar97._16_4_ * fVar178;
        auVar48._20_4_ = auVar97._20_4_ * fVar177;
        auVar48._24_4_ = auVar97._24_4_ * fVar166;
        auVar48._28_4_ = iVar2;
        auVar85 = vfmsub231ps_fma(auVar48,auVar112,auVar95);
        auVar180._0_4_ = auVar112._0_4_ * auVar104._0_4_;
        auVar180._4_4_ = auVar112._4_4_ * auVar104._4_4_;
        auVar180._8_4_ = auVar112._8_4_ * auVar104._8_4_;
        auVar180._12_4_ = auVar112._12_4_ * auVar104._12_4_;
        auVar180._16_4_ = fVar148 * auVar104._16_4_;
        auVar180._20_4_ = fVar149 * auVar104._20_4_;
        auVar180._24_4_ = fVar176 * auVar104._24_4_;
        auVar180._28_4_ = 0;
        auVar86 = vfmsub231ps_fma(auVar180,auVar97,auVar111);
        auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar90,auVar96);
        auVar92 = vfmadd231ps_avx512vl(auVar96,auVar90,ZEXT1632(auVar85));
        auVar183 = ZEXT3264(auVar92);
        auVar96 = vmaxps_avx(auVar100,auVar92);
        uVar23 = vcmpps_avx512vl(auVar96,auVar90,2);
        bVar81 = bVar81 & (byte)uVar23;
        if (bVar81 != 0) {
          auVar49._4_4_ = auVar95._4_4_ * auVar94._4_4_;
          auVar49._0_4_ = auVar95._0_4_ * auVar94._0_4_;
          auVar49._8_4_ = auVar95._8_4_ * auVar94._8_4_;
          auVar49._12_4_ = auVar95._12_4_ * auVar94._12_4_;
          auVar49._16_4_ = auVar95._16_4_ * auVar94._16_4_;
          auVar49._20_4_ = auVar95._20_4_ * auVar94._20_4_;
          auVar49._24_4_ = auVar95._24_4_ * auVar94._24_4_;
          auVar49._28_4_ = auVar96._28_4_;
          auVar7 = vfmsub231ps_fma(auVar49,auVar97,auVar105);
          auVar50._4_4_ = auVar105._4_4_ * auVar104._4_4_;
          auVar50._0_4_ = auVar105._0_4_ * auVar104._0_4_;
          auVar50._8_4_ = auVar105._8_4_ * auVar104._8_4_;
          auVar50._12_4_ = auVar105._12_4_ * auVar104._12_4_;
          auVar50._16_4_ = auVar105._16_4_ * auVar104._16_4_;
          auVar50._20_4_ = auVar105._20_4_ * auVar104._20_4_;
          auVar50._24_4_ = auVar105._24_4_ * auVar104._24_4_;
          auVar50._28_4_ = auVar105._28_4_;
          auVar6 = vfmsub231ps_fma(auVar50,auVar99,auVar95);
          auVar51._4_4_ = auVar97._4_4_ * auVar99._4_4_;
          auVar51._0_4_ = auVar97._0_4_ * auVar99._0_4_;
          auVar51._8_4_ = auVar97._8_4_ * auVar99._8_4_;
          auVar51._12_4_ = auVar97._12_4_ * auVar99._12_4_;
          auVar51._16_4_ = auVar97._16_4_ * auVar99._16_4_;
          auVar51._20_4_ = auVar97._20_4_ * auVar99._20_4_;
          auVar51._24_4_ = auVar97._24_4_ * auVar99._24_4_;
          auVar51._28_4_ = auVar97._28_4_;
          auVar8 = vfmsub231ps_fma(auVar51,auVar104,auVar94);
          auVar85 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar6),ZEXT1632(auVar8));
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar85),ZEXT1632(auVar7),ZEXT1232(ZEXT412(0)) << 0x20)
          ;
          auVar96 = vrcp14ps_avx512vl(ZEXT1632(auVar86));
          auVar27._8_4_ = 0x3f800000;
          auVar27._0_8_ = 0x3f8000003f800000;
          auVar27._12_4_ = 0x3f800000;
          auVar27._16_4_ = 0x3f800000;
          auVar27._20_4_ = 0x3f800000;
          auVar27._24_4_ = 0x3f800000;
          auVar27._28_4_ = 0x3f800000;
          auVar94 = vfnmadd213ps_avx512vl(auVar96,ZEXT1632(auVar86),auVar27);
          auVar85 = vfmadd132ps_fma(auVar94,auVar96,auVar96);
          auVar188 = ZEXT1664(auVar85);
          auVar52._4_4_ = auVar8._4_4_ * auVar110._4_4_;
          auVar52._0_4_ = auVar8._0_4_ * auVar110._0_4_;
          auVar52._8_4_ = auVar8._8_4_ * auVar110._8_4_;
          auVar52._12_4_ = auVar8._12_4_ * auVar110._12_4_;
          auVar52._16_4_ = fVar167 * 0.0;
          auVar52._20_4_ = fVar136 * 0.0;
          auVar52._24_4_ = fVar147 * 0.0;
          auVar52._28_4_ = iVar1;
          auVar6 = vfmadd231ps_fma(auVar52,auVar103,ZEXT1632(auVar6));
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar98,ZEXT1632(auVar7));
          fVar136 = auVar85._0_4_;
          fVar147 = auVar85._4_4_;
          fVar148 = auVar85._8_4_;
          fVar149 = auVar85._12_4_;
          local_280._28_4_ = auVar96._28_4_;
          local_280._0_28_ =
               ZEXT1628(CONCAT412(auVar6._12_4_ * fVar149,
                                  CONCAT48(auVar6._8_4_ * fVar148,
                                           CONCAT44(auVar6._4_4_ * fVar147,auVar6._0_4_ * fVar136)))
                       );
          auVar193 = ZEXT3264(local_280);
          auVar140._8_4_ = 3;
          auVar140._0_8_ = 0x300000003;
          auVar140._12_4_ = 3;
          auVar140._16_4_ = 3;
          auVar140._20_4_ = 3;
          auVar140._24_4_ = 3;
          auVar140._28_4_ = 3;
          auVar96 = vpermps_avx2(auVar140,ZEXT1632((undefined1  [16])aVar3));
          uVar23 = vcmpps_avx512vl(auVar96,local_280,2);
          fVar167 = (ray->super_RayK<1>).tfar;
          auVar28._4_4_ = fVar167;
          auVar28._0_4_ = fVar167;
          auVar28._8_4_ = fVar167;
          auVar28._12_4_ = fVar167;
          auVar28._16_4_ = fVar167;
          auVar28._20_4_ = fVar167;
          auVar28._24_4_ = fVar167;
          auVar28._28_4_ = fVar167;
          uVar25 = vcmpps_avx512vl(local_280,auVar28,2);
          bVar81 = (byte)uVar23 & (byte)uVar25 & bVar81;
          if (bVar81 != 0) {
            uVar82 = vcmpps_avx512vl(ZEXT1632(auVar86),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar82 = bVar81 & uVar82;
            if ((char)uVar82 != '\0') {
              fVar167 = auVar100._0_4_ * fVar136;
              fVar176 = auVar100._4_4_ * fVar147;
              auVar53._4_4_ = fVar176;
              auVar53._0_4_ = fVar167;
              fVar177 = auVar100._8_4_ * fVar148;
              auVar53._8_4_ = fVar177;
              fVar178 = auVar100._12_4_ * fVar149;
              auVar53._12_4_ = fVar178;
              fVar166 = auVar100._16_4_ * 0.0;
              auVar53._16_4_ = fVar166;
              fVar83 = auVar100._20_4_ * 0.0;
              auVar53._20_4_ = fVar83;
              fVar84 = auVar100._24_4_ * 0.0;
              auVar53._24_4_ = fVar84;
              auVar53._28_4_ = auVar100._28_4_;
              auVar141._8_4_ = 0x3f800000;
              auVar141._0_8_ = 0x3f8000003f800000;
              auVar141._12_4_ = 0x3f800000;
              auVar141._16_4_ = 0x3f800000;
              auVar141._20_4_ = 0x3f800000;
              auVar141._24_4_ = 0x3f800000;
              auVar141._28_4_ = 0x3f800000;
              auVar96 = vsubps_avx(auVar141,auVar53);
              local_2c0._0_4_ =
                   (float)((uint)(bVar72 & 1) * (int)fVar167 |
                          (uint)!(bool)(bVar72 & 1) * auVar96._0_4_);
              bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
              local_2c0._4_4_ = (float)((uint)bVar17 * (int)fVar176 | (uint)!bVar17 * auVar96._4_4_)
              ;
              bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
              local_2c0._8_4_ = (float)((uint)bVar17 * (int)fVar177 | (uint)!bVar17 * auVar96._8_4_)
              ;
              bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
              local_2c0._12_4_ =
                   (float)((uint)bVar17 * (int)fVar178 | (uint)!bVar17 * auVar96._12_4_);
              bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
              local_2c0._16_4_ =
                   (float)((uint)bVar17 * (int)fVar166 | (uint)!bVar17 * auVar96._16_4_);
              bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
              local_2c0._20_4_ =
                   (float)((uint)bVar17 * (int)fVar83 | (uint)!bVar17 * auVar96._20_4_);
              bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
              local_2c0._24_4_ =
                   (float)((uint)bVar17 * (int)fVar84 | (uint)!bVar17 * auVar96._24_4_);
              bVar17 = SUB81(uVar73 >> 7,0);
              local_2c0._28_4_ =
                   (float)((uint)bVar17 * auVar100._28_4_ | (uint)!bVar17 * auVar96._28_4_);
              auVar96 = vsubps_avx(auVar102,auVar101);
              auVar85 = vfmadd213ps_fma(auVar96,local_2c0,auVar101);
              fVar167 = pre->depth_scale;
              auVar29._4_4_ = fVar167;
              auVar29._0_4_ = fVar167;
              auVar29._8_4_ = fVar167;
              auVar29._12_4_ = fVar167;
              auVar29._16_4_ = fVar167;
              auVar29._20_4_ = fVar167;
              auVar29._24_4_ = fVar167;
              auVar29._28_4_ = fVar167;
              auVar96 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar85._12_4_ + auVar85._12_4_,
                                                           CONCAT48(auVar85._8_4_ + auVar85._8_4_,
                                                                    CONCAT44(auVar85._4_4_ +
                                                                             auVar85._4_4_,
                                                                             auVar85._0_4_ +
                                                                             auVar85._0_4_)))),
                                        auVar29);
              uVar24 = vcmpps_avx512vl(local_280,auVar96,6);
              uVar82 = uVar82 & uVar24;
              bVar81 = (byte)uVar82;
              if (bVar81 != 0) {
                auVar164._0_4_ = auVar92._0_4_ * fVar136;
                auVar164._4_4_ = auVar92._4_4_ * fVar147;
                auVar164._8_4_ = auVar92._8_4_ * fVar148;
                auVar164._12_4_ = auVar92._12_4_ * fVar149;
                auVar164._16_4_ = auVar92._16_4_ * 0.0;
                auVar164._20_4_ = auVar92._20_4_ * 0.0;
                auVar164._24_4_ = auVar92._24_4_ * 0.0;
                auVar164._28_4_ = 0;
                auVar173._8_4_ = 0x3f800000;
                auVar173._0_8_ = 0x3f8000003f800000;
                auVar173._12_4_ = 0x3f800000;
                auVar173._16_4_ = 0x3f800000;
                auVar173._20_4_ = 0x3f800000;
                auVar173._24_4_ = 0x3f800000;
                auVar173._28_4_ = 0x3f800000;
                auVar96 = vsubps_avx(auVar173,auVar164);
                auVar115._0_4_ =
                     (uint)(bVar72 & 1) * (int)auVar164._0_4_ |
                     (uint)!(bool)(bVar72 & 1) * auVar96._0_4_;
                bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
                auVar115._4_4_ = (uint)bVar17 * (int)auVar164._4_4_ | (uint)!bVar17 * auVar96._4_4_;
                bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
                auVar115._8_4_ = (uint)bVar17 * (int)auVar164._8_4_ | (uint)!bVar17 * auVar96._8_4_;
                bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
                auVar115._12_4_ =
                     (uint)bVar17 * (int)auVar164._12_4_ | (uint)!bVar17 * auVar96._12_4_;
                bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
                auVar115._16_4_ =
                     (uint)bVar17 * (int)auVar164._16_4_ | (uint)!bVar17 * auVar96._16_4_;
                bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
                auVar115._20_4_ =
                     (uint)bVar17 * (int)auVar164._20_4_ | (uint)!bVar17 * auVar96._20_4_;
                bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
                auVar115._24_4_ =
                     (uint)bVar17 * (int)auVar164._24_4_ | (uint)!bVar17 * auVar96._24_4_;
                auVar115._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar96._28_4_;
                auVar30._8_4_ = 0x40000000;
                auVar30._0_8_ = 0x4000000040000000;
                auVar30._12_4_ = 0x40000000;
                auVar30._16_4_ = 0x40000000;
                auVar30._20_4_ = 0x40000000;
                auVar30._24_4_ = 0x40000000;
                auVar30._28_4_ = 0x40000000;
                local_2a0 = vfmsub132ps_avx512vl(auVar115,auVar173,auVar30);
                local_260 = 0;
                local_25c = iVar14;
                local_250 = local_4d0._0_8_;
                uStack_248 = local_4d0._8_8_;
                local_240 = local_4c0._0_8_;
                uStack_238 = local_4c0._8_8_;
                local_230 = local_4f0._0_8_;
                uStack_228 = local_4f0._8_8_;
                local_220 = local_4e0;
                uStack_218 = uStack_4d8;
                if ((pGVar15->mask & (ray->super_RayK<1>).mask) != 0) {
                  fVar167 = 1.0 / auVar195._0_4_;
                  local_200[0] = fVar167 * (local_2c0._0_4_ + 0.0);
                  local_200[1] = fVar167 * (local_2c0._4_4_ + 1.0);
                  local_200[2] = fVar167 * (local_2c0._8_4_ + 2.0);
                  local_200[3] = fVar167 * (local_2c0._12_4_ + 3.0);
                  fStack_1f0 = fVar167 * (local_2c0._16_4_ + 4.0);
                  fStack_1ec = fVar167 * (local_2c0._20_4_ + 5.0);
                  fStack_1e8 = fVar167 * (local_2c0._24_4_ + 6.0);
                  fStack_1e4 = local_2c0._28_4_ + 7.0;
                  local_1e0 = local_2a0;
                  local_1c0 = local_280;
                  auVar142._8_4_ = 0x7f800000;
                  auVar142._0_8_ = 0x7f8000007f800000;
                  auVar142._12_4_ = 0x7f800000;
                  auVar142._16_4_ = 0x7f800000;
                  auVar142._20_4_ = 0x7f800000;
                  auVar142._24_4_ = 0x7f800000;
                  auVar142._28_4_ = 0x7f800000;
                  auVar96 = vblendmps_avx512vl(auVar142,local_280);
                  auVar116._0_4_ =
                       (uint)(bVar81 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar81 & 1) * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
                  auVar116._4_4_ = (uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
                  auVar116._8_4_ = (uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar82 >> 3) & 1);
                  auVar116._12_4_ = (uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar82 >> 4) & 1);
                  auVar116._16_4_ = (uint)bVar17 * auVar96._16_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar82 >> 5) & 1);
                  auVar116._20_4_ = (uint)bVar17 * auVar96._20_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar82 >> 6) & 1);
                  auVar116._24_4_ = (uint)bVar17 * auVar96._24_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = SUB81(uVar82 >> 7,0);
                  auVar116._28_4_ = (uint)bVar17 * auVar96._28_4_ | (uint)!bVar17 * 0x7f800000;
                  auVar96 = vshufps_avx(auVar116,auVar116,0xb1);
                  auVar96 = vminps_avx(auVar116,auVar96);
                  auVar94 = vshufpd_avx(auVar96,auVar96,5);
                  auVar96 = vminps_avx(auVar96,auVar94);
                  auVar94 = vpermpd_avx2(auVar96,0x4e);
                  auVar96 = vminps_avx(auVar96,auVar94);
                  uVar23 = vcmpps_avx512vl(auVar116,auVar96,0);
                  uVar75 = (uint)uVar82;
                  if (((byte)uVar23 & bVar81) != 0) {
                    uVar75 = (uint)((byte)uVar23 & bVar81);
                  }
                  uVar26 = 0;
                  for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                    uVar26 = uVar26 + 1;
                  }
                  uVar73 = (ulong)uVar26;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar15->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_400 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                    local_460 = local_280;
                    do {
                      local_494 = local_200[uVar73];
                      local_490 = *(undefined4 *)(local_1e0 + uVar73 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar73 * 4);
                      local_520.context = context->user;
                      fVar136 = 1.0 - local_494;
                      fVar167 = fVar136 * fVar136 * -3.0;
                      auVar183 = ZEXT464((uint)fVar167);
                      auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar136 * fVar136)),
                                                ZEXT416((uint)(local_494 * fVar136)),
                                                ZEXT416(0xc0000000));
                      auVar86 = vfmsub132ss_fma(ZEXT416((uint)(local_494 * fVar136)),
                                                ZEXT416((uint)(local_494 * local_494)),
                                                ZEXT416(0x40000000));
                      fVar136 = auVar85._0_4_ * 3.0;
                      fVar147 = auVar86._0_4_ * 3.0;
                      fVar148 = local_494 * local_494 * 3.0;
                      auVar187._0_4_ = fVar148 * (float)local_4e0._0_4_;
                      auVar187._4_4_ = fVar148 * (float)local_4e0._4_4_;
                      auVar187._8_4_ = fVar148 * (float)uStack_4d8;
                      auVar187._12_4_ = fVar148 * uStack_4d8._4_4_;
                      auVar188 = ZEXT1664(auVar187);
                      auVar161._4_4_ = fVar147;
                      auVar161._0_4_ = fVar147;
                      auVar161._8_4_ = fVar147;
                      auVar161._12_4_ = fVar147;
                      auVar85 = vfmadd132ps_fma(auVar161,auVar187,local_4f0);
                      auVar171._4_4_ = fVar136;
                      auVar171._0_4_ = fVar136;
                      auVar171._8_4_ = fVar136;
                      auVar171._12_4_ = fVar136;
                      auVar85 = vfmadd132ps_fma(auVar171,auVar85,local_4c0);
                      auVar162._4_4_ = fVar167;
                      auVar162._0_4_ = fVar167;
                      auVar162._8_4_ = fVar167;
                      auVar162._12_4_ = fVar167;
                      auVar85 = vfmadd132ps_fma(auVar162,auVar85,local_4d0);
                      local_4a0 = vmovlps_avx(auVar85);
                      local_498 = vextractps_avx(auVar85,2);
                      local_48c = (int)local_530;
                      local_488 = (int)local_548;
                      local_484 = (local_520.context)->instID[0];
                      local_480 = (local_520.context)->instPrimID[0];
                      local_54c = -1;
                      local_520.valid = &local_54c;
                      local_520.geometryUserPtr = pGVar15->userPtr;
                      local_520.ray = (RTCRayN *)ray;
                      local_520.hit = (RTCHitN *)&local_4a0;
                      local_520.N = 1;
                      if (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01cebf5c:
                        p_Var16 = context->args->filter;
                        if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar183 = ZEXT1664(auVar183._0_16_);
                          auVar188 = ZEXT1664(auVar188._0_16_);
                          (*p_Var16)(&local_520);
                          auVar193 = ZEXT3264(local_460);
                          auVar206 = ZEXT3264(local_420);
                          auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar207 = ZEXT1664(auVar85);
                          auVar96 = vbroadcastss_avx512vl(ZEXT416(2));
                          auVar205 = ZEXT3264(auVar96);
                          context = local_538;
                          ray = local_540;
                          if (*local_520.valid == 0) goto LAB_01cec00c;
                        }
                        (((Vec3f *)((long)local_520.ray + 0x30))->field_0).components[0] =
                             *(float *)local_520.hit;
                        (((Vec3f *)((long)local_520.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_520.hit + 4);
                        (((Vec3f *)((long)local_520.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_520.hit + 8);
                        *(float *)((long)local_520.ray + 0x3c) = *(float *)(local_520.hit + 0xc);
                        *(float *)((long)local_520.ray + 0x40) = *(float *)(local_520.hit + 0x10);
                        *(float *)((long)local_520.ray + 0x44) = *(float *)(local_520.hit + 0x14);
                        *(float *)((long)local_520.ray + 0x48) = *(float *)(local_520.hit + 0x18);
                        *(float *)((long)local_520.ray + 0x4c) = *(float *)(local_520.hit + 0x1c);
                        *(float *)((long)local_520.ray + 0x50) = *(float *)(local_520.hit + 0x20);
                      }
                      else {
                        auVar183 = ZEXT464((uint)fVar167);
                        auVar188 = ZEXT1664(auVar187);
                        (*pGVar15->intersectionFilterN)(&local_520);
                        auVar193 = ZEXT3264(local_460);
                        auVar206 = ZEXT3264(local_420);
                        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar207 = ZEXT1664(auVar85);
                        auVar96 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar205 = ZEXT3264(auVar96);
                        context = local_538;
                        ray = local_540;
                        if (*local_520.valid != 0) goto LAB_01cebf5c;
LAB_01cec00c:
                        (local_540->super_RayK<1>).tfar = (float)local_400._0_4_;
                        context = local_538;
                        ray = local_540;
                      }
                      bVar81 = ~(byte)(1 << ((uint)uVar73 & 0x1f)) & (byte)uVar82;
                      fVar167 = (ray->super_RayK<1>).tfar;
                      auVar37._4_4_ = fVar167;
                      auVar37._0_4_ = fVar167;
                      auVar37._8_4_ = fVar167;
                      auVar37._12_4_ = fVar167;
                      auVar37._16_4_ = fVar167;
                      auVar37._20_4_ = fVar167;
                      auVar37._24_4_ = fVar167;
                      auVar37._28_4_ = fVar167;
                      uVar23 = vcmpps_avx512vl(auVar193._0_32_,auVar37,2);
                      pre = local_528;
                      if ((bVar81 & (byte)uVar23) == 0) goto LAB_01ceb191;
                      local_400 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                      bVar81 = bVar81 & (byte)uVar23;
                      uVar82 = (ulong)bVar81;
                      auVar146._8_4_ = 0x7f800000;
                      auVar146._0_8_ = 0x7f8000007f800000;
                      auVar146._12_4_ = 0x7f800000;
                      auVar146._16_4_ = 0x7f800000;
                      auVar146._20_4_ = 0x7f800000;
                      auVar146._24_4_ = 0x7f800000;
                      auVar146._28_4_ = 0x7f800000;
                      auVar96 = vblendmps_avx512vl(auVar146,auVar193._0_32_);
                      auVar129._0_4_ =
                           (uint)(bVar81 & 1) * auVar96._0_4_ |
                           (uint)!(bool)(bVar81 & 1) * 0x7f800000;
                      bVar17 = (bool)(bVar81 >> 1 & 1);
                      auVar129._4_4_ = (uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar81 >> 2 & 1);
                      auVar129._8_4_ = (uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar81 >> 3 & 1);
                      auVar129._12_4_ = (uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar81 >> 4 & 1);
                      auVar129._16_4_ = (uint)bVar17 * auVar96._16_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar81 >> 5 & 1);
                      auVar129._20_4_ = (uint)bVar17 * auVar96._20_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar81 >> 6 & 1);
                      auVar129._24_4_ = (uint)bVar17 * auVar96._24_4_ | (uint)!bVar17 * 0x7f800000;
                      auVar129._28_4_ =
                           (uint)(bVar81 >> 7) * auVar96._28_4_ |
                           (uint)!(bool)(bVar81 >> 7) * 0x7f800000;
                      auVar96 = vshufps_avx(auVar129,auVar129,0xb1);
                      auVar96 = vminps_avx(auVar129,auVar96);
                      auVar94 = vshufpd_avx(auVar96,auVar96,5);
                      auVar96 = vminps_avx(auVar96,auVar94);
                      auVar94 = vpermpd_avx2(auVar96,0x4e);
                      auVar96 = vminps_avx(auVar96,auVar94);
                      uVar23 = vcmpps_avx512vl(auVar129,auVar96,0);
                      bVar72 = (byte)uVar23 & bVar81;
                      if (bVar72 != 0) {
                        bVar81 = bVar72;
                      }
                      uVar80 = 0;
                      for (uVar76 = (uint)bVar81; (uVar76 & 1) == 0;
                          uVar76 = uVar76 >> 1 | 0x80000000) {
                        uVar80 = uVar80 + 1;
                      }
                      uVar73 = (ulong)uVar80;
                    } while( true );
                  }
                  fVar167 = local_200[uVar73];
                  fVar136 = *(float *)(local_1e0 + uVar73 * 4);
                  fVar148 = 1.0 - fVar167;
                  fVar147 = fVar148 * fVar148 * -3.0;
                  auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148)),
                                            ZEXT416((uint)(fVar167 * fVar148)),ZEXT416(0xc0000000));
                  auVar86 = vfmsub132ss_fma(ZEXT416((uint)(fVar167 * fVar148)),
                                            ZEXT416((uint)(fVar167 * fVar167)),ZEXT416(0x40000000));
                  fVar148 = auVar85._0_4_ * 3.0;
                  fVar149 = auVar86._0_4_ * 3.0;
                  fVar176 = fVar167 * fVar167 * 3.0;
                  auVar184._0_4_ = fVar176 * (float)local_4e0._0_4_;
                  auVar184._4_4_ = fVar176 * (float)local_4e0._4_4_;
                  auVar184._8_4_ = fVar176 * (float)uStack_4d8;
                  auVar184._12_4_ = fVar176 * uStack_4d8._4_4_;
                  auVar188 = ZEXT1664(auVar184);
                  auVar155._4_4_ = fVar149;
                  auVar155._0_4_ = fVar149;
                  auVar155._8_4_ = fVar149;
                  auVar155._12_4_ = fVar149;
                  auVar85 = vfmadd132ps_fma(auVar155,auVar184,local_4f0);
                  auVar168._4_4_ = fVar148;
                  auVar168._0_4_ = fVar148;
                  auVar168._8_4_ = fVar148;
                  auVar168._12_4_ = fVar148;
                  auVar85 = vfmadd132ps_fma(auVar168,auVar85,local_4c0);
                  auVar156._4_4_ = fVar147;
                  auVar156._0_4_ = fVar147;
                  auVar156._8_4_ = fVar147;
                  auVar156._12_4_ = fVar147;
                  auVar183 = ZEXT464((uint)*(float *)(local_1c0 + uVar73 * 4));
                  (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar73 * 4);
                  auVar85 = vfmadd132ps_fma(auVar156,auVar85,local_4d0);
                  uVar23 = vmovlps_avx(auVar85);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar23;
                  fVar147 = (float)vextractps_avx(auVar85,2);
                  (ray->Ng).field_0.field_0.z = fVar147;
                  ray->u = fVar167;
                  ray->v = fVar136;
                  ray->primID = uVar76;
                  ray->geomID = uVar80;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                  pre = local_528;
                }
              }
            }
          }
        }
      }
LAB_01ceb191:
      if (8 < iVar14) {
        auVar96 = vpbroadcastd_avx512vl();
        auVar208 = ZEXT3264(auVar96);
        local_400._4_4_ = local_440._0_4_;
        local_400._0_4_ = local_440._0_4_;
        local_400._8_4_ = local_440._0_4_;
        local_400._12_4_ = local_440._0_4_;
        local_400._16_4_ = local_440._0_4_;
        local_400._20_4_ = local_440._0_4_;
        local_400._24_4_ = local_440._0_4_;
        local_400._28_4_ = local_440._0_4_;
        auVar143._8_4_ = 3;
        auVar143._0_8_ = 0x300000003;
        auVar143._12_4_ = 3;
        auVar143._16_4_ = 3;
        auVar143._20_4_ = 3;
        auVar143._24_4_ = 3;
        auVar143._28_4_ = 3;
        local_3e0 = vpermps_avx2(auVar143,local_3e0);
        local_120 = 1.0 / (float)local_4b0._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        lVar78 = 8;
LAB_01ceb222:
        auVar96 = vpbroadcastd_avx512vl();
        auVar96 = vpor_avx2(auVar96,_DAT_01fe9900);
        uVar25 = vpcmpgtd_avx512vl(auVar208._0_32_,auVar96);
        auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 * 4 + lVar71);
        auVar94 = *(undefined1 (*) [32])(lVar71 + 0x21aa768 + lVar78 * 4);
        auVar105 = *(undefined1 (*) [32])(lVar71 + 0x21aabec + lVar78 * 4);
        auVar104 = *(undefined1 (*) [32])(lVar71 + 0x21ab070 + lVar78 * 4);
        auVar189._0_4_ = auVar104._0_4_ * (float)local_3a0._0_4_;
        auVar189._4_4_ = auVar104._4_4_ * (float)local_3a0._4_4_;
        auVar189._8_4_ = auVar104._8_4_ * fStack_398;
        auVar189._12_4_ = auVar104._12_4_ * fStack_394;
        auVar189._16_4_ = auVar104._16_4_ * fStack_390;
        auVar189._20_4_ = auVar104._20_4_ * fStack_38c;
        auVar189._28_36_ = auVar188._28_36_;
        auVar189._24_4_ = auVar104._24_4_ * fStack_388;
        auVar188._0_4_ = auVar104._0_4_ * (float)local_3c0._0_4_;
        auVar188._4_4_ = auVar104._4_4_ * (float)local_3c0._4_4_;
        auVar188._8_4_ = auVar104._8_4_ * fStack_3b8;
        auVar188._12_4_ = auVar104._12_4_ * fStack_3b4;
        auVar188._16_4_ = auVar104._16_4_ * fStack_3b0;
        auVar188._20_4_ = auVar104._20_4_ * fStack_3ac;
        auVar188._28_36_ = auVar183._28_36_;
        auVar188._24_4_ = auVar104._24_4_ * fStack_3a8;
        auVar97 = vmulps_avx512vl(local_e0,auVar104);
        auVar95 = vfmadd231ps_avx512vl(auVar189._0_32_,auVar105,local_360);
        auVar98 = vfmadd231ps_avx512vl(auVar188._0_32_,auVar105,local_380);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar105,local_c0);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar94,local_320);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_340);
        auVar103 = vfmadd231ps_avx512vl(auVar97,auVar94,local_a0);
        auVar85 = vfmadd231ps_fma(auVar95,auVar96,local_2e0);
        auVar188 = ZEXT1664(auVar85);
        auVar86 = vfmadd231ps_fma(auVar98,auVar96,local_300);
        auVar183 = ZEXT1664(auVar86);
        auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 * 4 + lVar71);
        auVar95 = *(undefined1 (*) [32])(lVar71 + 0x21acb88 + lVar78 * 4);
        auVar92 = vfmadd231ps_avx512vl(auVar103,auVar96,local_100);
        auVar98 = *(undefined1 (*) [32])(lVar71 + 0x21ad00c + lVar78 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar71 + 0x21ad490 + lVar78 * 4);
        auVar194._0_4_ = auVar103._0_4_ * (float)local_3a0._0_4_;
        auVar194._4_4_ = auVar103._4_4_ * (float)local_3a0._4_4_;
        auVar194._8_4_ = auVar103._8_4_ * fStack_398;
        auVar194._12_4_ = auVar103._12_4_ * fStack_394;
        auVar194._16_4_ = auVar103._16_4_ * fStack_390;
        auVar194._20_4_ = auVar103._20_4_ * fStack_38c;
        auVar194._28_36_ = auVar193._28_36_;
        auVar194._24_4_ = auVar103._24_4_ * fStack_388;
        auVar54._4_4_ = auVar103._4_4_ * (float)local_3c0._4_4_;
        auVar54._0_4_ = auVar103._0_4_ * (float)local_3c0._0_4_;
        auVar54._8_4_ = auVar103._8_4_ * fStack_3b8;
        auVar54._12_4_ = auVar103._12_4_ * fStack_3b4;
        auVar54._16_4_ = auVar103._16_4_ * fStack_3b0;
        auVar54._20_4_ = auVar103._20_4_ * fStack_3ac;
        auVar54._24_4_ = auVar103._24_4_ * fStack_3a8;
        auVar54._28_4_ = uStack_3a4;
        auVar99 = vmulps_avx512vl(local_e0,auVar103);
        auVar100 = vfmadd231ps_avx512vl(auVar194._0_32_,auVar98,local_360);
        auVar101 = vfmadd231ps_avx512vl(auVar54,auVar98,local_380);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar98,local_c0);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar95,local_320);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar95,local_340);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar95,local_a0);
        auVar6 = vfmadd231ps_fma(auVar100,auVar97,local_2e0);
        auVar193 = ZEXT1664(auVar6);
        auVar7 = vfmadd231ps_fma(auVar101,auVar97,local_300);
        auVar101 = vfmadd231ps_avx512vl(auVar99,auVar97,local_100);
        auVar102 = vmaxps_avx512vl(auVar92,auVar101);
        auVar99 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar85));
        auVar100 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar86));
        auVar90 = vmulps_avx512vl(ZEXT1632(auVar86),auVar99);
        auVar91 = vmulps_avx512vl(ZEXT1632(auVar85),auVar100);
        auVar90 = vsubps_avx512vl(auVar90,auVar91);
        auVar91 = vmulps_avx512vl(auVar100,auVar100);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar99,auVar99);
        auVar102 = vmulps_avx512vl(auVar102,auVar102);
        auVar102 = vmulps_avx512vl(auVar102,auVar91);
        auVar90 = vmulps_avx512vl(auVar90,auVar90);
        uVar23 = vcmpps_avx512vl(auVar90,auVar102,2);
        bVar81 = (byte)uVar25 & (byte)uVar23;
        if (bVar81 != 0) {
          in_ZMM25 = ZEXT3264(local_1a0);
          auVar103 = vmulps_avx512vl(local_1a0,auVar103);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_180,auVar103);
          auVar95 = vfmadd213ps_avx512vl(auVar95,local_160,auVar98);
          local_420 = auVar206._0_32_;
          auVar97 = vfmadd213ps_avx512vl(auVar97,local_420,auVar95);
          auVar104 = vmulps_avx512vl(local_1a0,auVar104);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_180,auVar104);
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_160,auVar105);
          auVar95 = vfmadd213ps_avx512vl(auVar96,local_420,auVar94);
          auVar96 = *(undefined1 (*) [32])(lVar71 + 0x21ab4f4 + lVar78 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar71 + 0x21ab978 + lVar78 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar71 + 0x21abdfc + lVar78 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar71 + 0x21ac280 + lVar78 * 4);
          auVar98 = vmulps_avx512vl(_local_3a0,auVar104);
          auVar103 = vmulps_avx512vl(_local_3c0,auVar104);
          auVar104 = vmulps_avx512vl(local_1a0,auVar104);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar105,local_360);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar105,local_380);
          auVar105 = vfmadd231ps_avx512vl(auVar104,local_180,auVar105);
          auVar104 = vfmadd231ps_avx512vl(auVar98,auVar94,local_320);
          auVar98 = vfmadd231ps_avx512vl(auVar103,auVar94,local_340);
          auVar94 = vfmadd231ps_avx512vl(auVar105,local_160,auVar94);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar96,local_2e0);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar96,local_300);
          auVar103 = vfmadd231ps_avx512vl(auVar94,local_420,auVar96);
          auVar96 = *(undefined1 (*) [32])(lVar71 + 0x21ad914 + lVar78 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar71 + 0x21ae21c + lVar78 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar71 + 0x21ae6a0 + lVar78 * 4);
          auVar102 = vmulps_avx512vl(_local_3a0,auVar105);
          auVar90 = vmulps_avx512vl(_local_3c0,auVar105);
          auVar105 = vmulps_avx512vl(local_1a0,auVar105);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar94,local_360);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar94,local_380);
          auVar105 = vfmadd231ps_avx512vl(auVar105,local_180,auVar94);
          auVar94 = *(undefined1 (*) [32])(lVar71 + 0x21add98 + lVar78 * 4);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar94,local_320);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar94,local_340);
          auVar94 = vfmadd231ps_avx512vl(auVar105,local_160,auVar94);
          auVar105 = vfmadd231ps_avx512vl(auVar102,auVar96,local_2e0);
          auVar102 = vfmadd231ps_avx512vl(auVar90,auVar96,local_300);
          auVar94 = vfmadd231ps_avx512vl(auVar94,local_420,auVar96);
          auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar104,auVar90);
          vandps_avx512vl(auVar98,auVar90);
          auVar96 = vmaxps_avx(auVar90,auVar90);
          vandps_avx512vl(auVar103,auVar90);
          auVar96 = vmaxps_avx(auVar96,auVar90);
          uVar73 = vcmpps_avx512vl(auVar96,local_400,1);
          bVar17 = (bool)((byte)uVar73 & 1);
          auVar117._0_4_ = (float)((uint)bVar17 * auVar99._0_4_ | (uint)!bVar17 * auVar104._0_4_);
          bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar17 * auVar99._4_4_ | (uint)!bVar17 * auVar104._4_4_);
          bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar17 * auVar99._8_4_ | (uint)!bVar17 * auVar104._8_4_);
          bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar17 * auVar99._12_4_ | (uint)!bVar17 * auVar104._12_4_)
          ;
          bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar117._16_4_ = (float)((uint)bVar17 * auVar99._16_4_ | (uint)!bVar17 * auVar104._16_4_)
          ;
          bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar117._20_4_ = (float)((uint)bVar17 * auVar99._20_4_ | (uint)!bVar17 * auVar104._20_4_)
          ;
          bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar117._24_4_ = (float)((uint)bVar17 * auVar99._24_4_ | (uint)!bVar17 * auVar104._24_4_)
          ;
          bVar17 = SUB81(uVar73 >> 7,0);
          auVar117._28_4_ = (uint)bVar17 * auVar99._28_4_ | (uint)!bVar17 * auVar104._28_4_;
          bVar17 = (bool)((byte)uVar73 & 1);
          auVar118._0_4_ = (float)((uint)bVar17 * auVar100._0_4_ | (uint)!bVar17 * auVar98._0_4_);
          bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar17 * auVar100._4_4_ | (uint)!bVar17 * auVar98._4_4_);
          bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar17 * auVar100._8_4_ | (uint)!bVar17 * auVar98._8_4_);
          bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar17 * auVar100._12_4_ | (uint)!bVar17 * auVar98._12_4_)
          ;
          bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar118._16_4_ = (float)((uint)bVar17 * auVar100._16_4_ | (uint)!bVar17 * auVar98._16_4_)
          ;
          bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar118._20_4_ = (float)((uint)bVar17 * auVar100._20_4_ | (uint)!bVar17 * auVar98._20_4_)
          ;
          bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar118._24_4_ = (float)((uint)bVar17 * auVar100._24_4_ | (uint)!bVar17 * auVar98._24_4_)
          ;
          bVar17 = SUB81(uVar73 >> 7,0);
          auVar118._28_4_ = (uint)bVar17 * auVar100._28_4_ | (uint)!bVar17 * auVar98._28_4_;
          vandps_avx512vl(auVar105,auVar90);
          vandps_avx512vl(auVar102,auVar90);
          auVar96 = vmaxps_avx(auVar118,auVar118);
          vandps_avx512vl(auVar94,auVar90);
          auVar96 = vmaxps_avx(auVar96,auVar118);
          uVar73 = vcmpps_avx512vl(auVar96,local_400,1);
          bVar17 = (bool)((byte)uVar73 & 1);
          auVar119._0_4_ = (uint)bVar17 * auVar99._0_4_ | (uint)!bVar17 * auVar105._0_4_;
          bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar119._4_4_ = (uint)bVar17 * auVar99._4_4_ | (uint)!bVar17 * auVar105._4_4_;
          bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar119._8_4_ = (uint)bVar17 * auVar99._8_4_ | (uint)!bVar17 * auVar105._8_4_;
          bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar119._12_4_ = (uint)bVar17 * auVar99._12_4_ | (uint)!bVar17 * auVar105._12_4_;
          bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar119._16_4_ = (uint)bVar17 * auVar99._16_4_ | (uint)!bVar17 * auVar105._16_4_;
          bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar119._20_4_ = (uint)bVar17 * auVar99._20_4_ | (uint)!bVar17 * auVar105._20_4_;
          bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar119._24_4_ = (uint)bVar17 * auVar99._24_4_ | (uint)!bVar17 * auVar105._24_4_;
          bVar17 = SUB81(uVar73 >> 7,0);
          auVar119._28_4_ = (uint)bVar17 * auVar99._28_4_ | (uint)!bVar17 * auVar105._28_4_;
          bVar17 = (bool)((byte)uVar73 & 1);
          auVar120._0_4_ = (float)((uint)bVar17 * auVar100._0_4_ | (uint)!bVar17 * auVar102._0_4_);
          bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar17 * auVar100._4_4_ | (uint)!bVar17 * auVar102._4_4_);
          bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar17 * auVar100._8_4_ | (uint)!bVar17 * auVar102._8_4_);
          bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar120._12_4_ =
               (float)((uint)bVar17 * auVar100._12_4_ | (uint)!bVar17 * auVar102._12_4_);
          bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar120._16_4_ =
               (float)((uint)bVar17 * auVar100._16_4_ | (uint)!bVar17 * auVar102._16_4_);
          bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar120._20_4_ =
               (float)((uint)bVar17 * auVar100._20_4_ | (uint)!bVar17 * auVar102._20_4_);
          bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar120._24_4_ =
               (float)((uint)bVar17 * auVar100._24_4_ | (uint)!bVar17 * auVar102._24_4_);
          bVar17 = SUB81(uVar73 >> 7,0);
          auVar120._28_4_ = (uint)bVar17 * auVar100._28_4_ | (uint)!bVar17 * auVar102._28_4_;
          auVar196._8_4_ = 0x80000000;
          auVar196._0_8_ = 0x8000000080000000;
          auVar196._12_4_ = 0x80000000;
          auVar196._16_4_ = 0x80000000;
          auVar196._20_4_ = 0x80000000;
          auVar196._24_4_ = 0x80000000;
          auVar196._28_4_ = 0x80000000;
          auVar96 = vxorps_avx512vl(auVar119,auVar196);
          auVar89 = vxorps_avx512vl(auVar90._0_16_,auVar90._0_16_);
          auVar94 = vfmadd213ps_avx512vl(auVar117,auVar117,ZEXT1632(auVar89));
          auVar8 = vfmadd231ps_fma(auVar94,auVar118,auVar118);
          auVar94 = vrsqrt14ps_avx512vl(ZEXT1632(auVar8));
          auVar204._8_4_ = 0xbf000000;
          auVar204._0_8_ = 0xbf000000bf000000;
          auVar204._12_4_ = 0xbf000000;
          auVar204._16_4_ = 0xbf000000;
          auVar204._20_4_ = 0xbf000000;
          auVar204._24_4_ = 0xbf000000;
          auVar204._28_4_ = 0xbf000000;
          fVar167 = auVar94._0_4_;
          fVar136 = auVar94._4_4_;
          fVar147 = auVar94._8_4_;
          fVar148 = auVar94._12_4_;
          fVar149 = auVar94._16_4_;
          fVar176 = auVar94._20_4_;
          fVar177 = auVar94._24_4_;
          auVar55._4_4_ = fVar136 * fVar136 * fVar136 * auVar8._4_4_ * -0.5;
          auVar55._0_4_ = fVar167 * fVar167 * fVar167 * auVar8._0_4_ * -0.5;
          auVar55._8_4_ = fVar147 * fVar147 * fVar147 * auVar8._8_4_ * -0.5;
          auVar55._12_4_ = fVar148 * fVar148 * fVar148 * auVar8._12_4_ * -0.5;
          auVar55._16_4_ = fVar149 * fVar149 * fVar149 * -0.0;
          auVar55._20_4_ = fVar176 * fVar176 * fVar176 * -0.0;
          auVar55._24_4_ = fVar177 * fVar177 * fVar177 * -0.0;
          auVar55._28_4_ = auVar118._28_4_;
          auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar94 = vfmadd231ps_avx512vl(auVar55,auVar105,auVar94);
          auVar56._4_4_ = auVar118._4_4_ * auVar94._4_4_;
          auVar56._0_4_ = auVar118._0_4_ * auVar94._0_4_;
          auVar56._8_4_ = auVar118._8_4_ * auVar94._8_4_;
          auVar56._12_4_ = auVar118._12_4_ * auVar94._12_4_;
          auVar56._16_4_ = auVar118._16_4_ * auVar94._16_4_;
          auVar56._20_4_ = auVar118._20_4_ * auVar94._20_4_;
          auVar56._24_4_ = auVar118._24_4_ * auVar94._24_4_;
          auVar56._28_4_ = 0;
          auVar57._4_4_ = auVar94._4_4_ * -auVar117._4_4_;
          auVar57._0_4_ = auVar94._0_4_ * -auVar117._0_4_;
          auVar57._8_4_ = auVar94._8_4_ * -auVar117._8_4_;
          auVar57._12_4_ = auVar94._12_4_ * -auVar117._12_4_;
          auVar57._16_4_ = auVar94._16_4_ * -auVar117._16_4_;
          auVar57._20_4_ = auVar94._20_4_ * -auVar117._20_4_;
          auVar57._24_4_ = auVar94._24_4_ * -auVar117._24_4_;
          auVar57._28_4_ = auVar118._28_4_;
          auVar104 = vmulps_avx512vl(auVar94,ZEXT1632(auVar89));
          auVar103 = ZEXT1632(auVar89);
          auVar94 = vfmadd213ps_avx512vl(auVar119,auVar119,auVar103);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar120,auVar120);
          auVar98 = vrsqrt14ps_avx512vl(auVar94);
          auVar94 = vmulps_avx512vl(auVar94,auVar204);
          fVar167 = auVar98._0_4_;
          fVar136 = auVar98._4_4_;
          fVar147 = auVar98._8_4_;
          fVar148 = auVar98._12_4_;
          fVar149 = auVar98._16_4_;
          fVar176 = auVar98._20_4_;
          fVar177 = auVar98._24_4_;
          auVar58._4_4_ = fVar136 * fVar136 * fVar136 * auVar94._4_4_;
          auVar58._0_4_ = fVar167 * fVar167 * fVar167 * auVar94._0_4_;
          auVar58._8_4_ = fVar147 * fVar147 * fVar147 * auVar94._8_4_;
          auVar58._12_4_ = fVar148 * fVar148 * fVar148 * auVar94._12_4_;
          auVar58._16_4_ = fVar149 * fVar149 * fVar149 * auVar94._16_4_;
          auVar58._20_4_ = fVar176 * fVar176 * fVar176 * auVar94._20_4_;
          auVar58._24_4_ = fVar177 * fVar177 * fVar177 * auVar94._24_4_;
          auVar58._28_4_ = auVar94._28_4_;
          auVar94 = vfmadd231ps_avx512vl(auVar58,auVar105,auVar98);
          auVar59._4_4_ = auVar120._4_4_ * auVar94._4_4_;
          auVar59._0_4_ = auVar120._0_4_ * auVar94._0_4_;
          auVar59._8_4_ = auVar120._8_4_ * auVar94._8_4_;
          auVar59._12_4_ = auVar120._12_4_ * auVar94._12_4_;
          auVar59._16_4_ = auVar120._16_4_ * auVar94._16_4_;
          auVar59._20_4_ = auVar120._20_4_ * auVar94._20_4_;
          auVar59._24_4_ = auVar120._24_4_ * auVar94._24_4_;
          auVar59._28_4_ = auVar98._28_4_;
          auVar60._4_4_ = auVar94._4_4_ * auVar96._4_4_;
          auVar60._0_4_ = auVar94._0_4_ * auVar96._0_4_;
          auVar60._8_4_ = auVar94._8_4_ * auVar96._8_4_;
          auVar60._12_4_ = auVar94._12_4_ * auVar96._12_4_;
          auVar60._16_4_ = auVar94._16_4_ * auVar96._16_4_;
          auVar60._20_4_ = auVar94._20_4_ * auVar96._20_4_;
          auVar60._24_4_ = auVar94._24_4_ * auVar96._24_4_;
          auVar60._28_4_ = auVar96._28_4_;
          auVar96 = vmulps_avx512vl(auVar94,auVar103);
          auVar8 = vfmadd213ps_fma(auVar56,auVar92,ZEXT1632(auVar85));
          auVar9 = vfmadd213ps_fma(auVar57,auVar92,ZEXT1632(auVar86));
          auVar105 = vfmadd213ps_avx512vl(auVar104,auVar92,auVar95);
          auVar98 = vfmadd213ps_avx512vl(auVar59,auVar101,ZEXT1632(auVar6));
          auVar11 = vfnmadd213ps_fma(auVar56,auVar92,ZEXT1632(auVar85));
          auVar85 = vfmadd213ps_fma(auVar60,auVar101,ZEXT1632(auVar7));
          auVar12 = vfnmadd213ps_fma(auVar57,auVar92,ZEXT1632(auVar86));
          auVar86 = vfmadd213ps_fma(auVar96,auVar101,auVar97);
          auVar152 = vfnmadd231ps_fma(auVar95,auVar92,auVar104);
          auVar150 = vfnmadd213ps_fma(auVar59,auVar101,ZEXT1632(auVar6));
          auVar151 = vfnmadd213ps_fma(auVar60,auVar101,ZEXT1632(auVar7));
          auVar161 = vfnmadd231ps_fma(auVar97,auVar101,auVar96);
          auVar97 = vsubps_avx512vl(auVar98,ZEXT1632(auVar11));
          auVar96 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar12));
          auVar94 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar152));
          auVar61._4_4_ = auVar96._4_4_ * auVar152._4_4_;
          auVar61._0_4_ = auVar96._0_4_ * auVar152._0_4_;
          auVar61._8_4_ = auVar96._8_4_ * auVar152._8_4_;
          auVar61._12_4_ = auVar96._12_4_ * auVar152._12_4_;
          auVar61._16_4_ = auVar96._16_4_ * 0.0;
          auVar61._20_4_ = auVar96._20_4_ * 0.0;
          auVar61._24_4_ = auVar96._24_4_ * 0.0;
          auVar61._28_4_ = auVar104._28_4_;
          auVar6 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar12),auVar94);
          auVar62._4_4_ = auVar94._4_4_ * auVar11._4_4_;
          auVar62._0_4_ = auVar94._0_4_ * auVar11._0_4_;
          auVar62._8_4_ = auVar94._8_4_ * auVar11._8_4_;
          auVar62._12_4_ = auVar94._12_4_ * auVar11._12_4_;
          auVar62._16_4_ = auVar94._16_4_ * 0.0;
          auVar62._20_4_ = auVar94._20_4_ * 0.0;
          auVar62._24_4_ = auVar94._24_4_ * 0.0;
          auVar62._28_4_ = auVar94._28_4_;
          auVar7 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar152),auVar97);
          auVar63._4_4_ = auVar12._4_4_ * auVar97._4_4_;
          auVar63._0_4_ = auVar12._0_4_ * auVar97._0_4_;
          auVar63._8_4_ = auVar12._8_4_ * auVar97._8_4_;
          auVar63._12_4_ = auVar12._12_4_ * auVar97._12_4_;
          auVar63._16_4_ = auVar97._16_4_ * 0.0;
          auVar63._20_4_ = auVar97._20_4_ * 0.0;
          auVar63._24_4_ = auVar97._24_4_ * 0.0;
          auVar63._28_4_ = auVar97._28_4_;
          auVar10 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar11),auVar96);
          auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar103,ZEXT1632(auVar7));
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar103,ZEXT1632(auVar6));
          auVar90 = ZEXT1632(auVar89);
          uVar73 = vcmpps_avx512vl(auVar96,auVar90,2);
          bVar72 = (byte)uVar73;
          fVar83 = (float)((uint)(bVar72 & 1) * auVar8._0_4_ |
                          (uint)!(bool)(bVar72 & 1) * auVar150._0_4_);
          bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
          fVar130 = (float)((uint)bVar17 * auVar8._4_4_ | (uint)!bVar17 * auVar150._4_4_);
          bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
          fVar132 = (float)((uint)bVar17 * auVar8._8_4_ | (uint)!bVar17 * auVar150._8_4_);
          bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
          fVar134 = (float)((uint)bVar17 * auVar8._12_4_ | (uint)!bVar17 * auVar150._12_4_);
          auVar103 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar132,CONCAT44(fVar130,fVar83))));
          fVar84 = (float)((uint)(bVar72 & 1) * auVar9._0_4_ |
                          (uint)!(bool)(bVar72 & 1) * auVar151._0_4_);
          bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
          fVar131 = (float)((uint)bVar17 * auVar9._4_4_ | (uint)!bVar17 * auVar151._4_4_);
          bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
          fVar133 = (float)((uint)bVar17 * auVar9._8_4_ | (uint)!bVar17 * auVar151._8_4_);
          bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
          fVar135 = (float)((uint)bVar17 * auVar9._12_4_ | (uint)!bVar17 * auVar151._12_4_);
          auVar99 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar133,CONCAT44(fVar131,fVar84))));
          auVar121._0_4_ =
               (float)((uint)(bVar72 & 1) * auVar105._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar161._0_4_);
          bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar17 * auVar105._4_4_ | (uint)!bVar17 * auVar161._4_4_);
          bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar17 * auVar105._8_4_ | (uint)!bVar17 * auVar161._8_4_);
          bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar121._12_4_ =
               (float)((uint)bVar17 * auVar105._12_4_ | (uint)!bVar17 * auVar161._12_4_);
          fVar167 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar105._16_4_);
          auVar121._16_4_ = fVar167;
          fVar136 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar105._20_4_);
          auVar121._20_4_ = fVar136;
          fVar147 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar105._24_4_);
          auVar121._24_4_ = fVar147;
          iVar1 = (uint)(byte)(uVar73 >> 7) * auVar105._28_4_;
          auVar121._28_4_ = iVar1;
          auVar96 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar98);
          auVar122._0_4_ =
               (uint)(bVar72 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar6._0_4_;
          bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar6._4_4_;
          bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar6._8_4_;
          bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar6._12_4_;
          auVar122._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar96._16_4_;
          auVar122._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar96._20_4_;
          auVar122._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar96._24_4_;
          auVar122._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar96._28_4_;
          auVar96 = vblendmps_avx512vl(ZEXT1632(auVar12),ZEXT1632(auVar85));
          auVar123._0_4_ =
               (float)((uint)(bVar72 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar8._0_4_
                      );
          bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar8._4_4_);
          bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar8._8_4_);
          bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar8._12_4_);
          fVar148 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar96._16_4_);
          auVar123._16_4_ = fVar148;
          fVar176 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar96._20_4_);
          auVar123._20_4_ = fVar176;
          fVar149 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar96._24_4_);
          auVar123._24_4_ = fVar149;
          auVar123._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar96._28_4_;
          auVar96 = vblendmps_avx512vl(ZEXT1632(auVar152),ZEXT1632(auVar86));
          auVar124._0_4_ =
               (float)((uint)(bVar72 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar9._0_4_
                      );
          bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar9._4_4_);
          bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar9._8_4_);
          bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar9._12_4_);
          fVar166 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar96._16_4_);
          auVar124._16_4_ = fVar166;
          fVar178 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar96._20_4_);
          auVar124._20_4_ = fVar178;
          fVar177 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar96._24_4_);
          auVar124._24_4_ = fVar177;
          iVar2 = (uint)(byte)(uVar73 >> 7) * auVar96._28_4_;
          auVar124._28_4_ = iVar2;
          auVar125._0_4_ =
               (uint)(bVar72 & 1) * (int)auVar11._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar98._0_4_;
          bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar17 * (int)auVar11._4_4_ | (uint)!bVar17 * auVar98._4_4_;
          bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar17 * (int)auVar11._8_4_ | (uint)!bVar17 * auVar98._8_4_;
          bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar17 * (int)auVar11._12_4_ | (uint)!bVar17 * auVar98._12_4_;
          auVar125._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar98._16_4_;
          auVar125._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar98._20_4_;
          auVar125._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar98._24_4_;
          auVar125._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar98._28_4_;
          bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar73 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar73 >> 3) & 1);
          bVar18 = (bool)((byte)(uVar73 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar73 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar98 = vsubps_avx512vl(auVar125,auVar103);
          auVar94 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar12._12_4_ |
                                                  (uint)!bVar21 * auVar85._12_4_,
                                                  CONCAT48((uint)bVar19 * (int)auVar12._8_4_ |
                                                           (uint)!bVar19 * auVar85._8_4_,
                                                           CONCAT44((uint)bVar17 *
                                                                    (int)auVar12._4_4_ |
                                                                    (uint)!bVar17 * auVar85._4_4_,
                                                                    (uint)(bVar72 & 1) *
                                                                    (int)auVar12._0_4_ |
                                                                    (uint)!(bool)(bVar72 & 1) *
                                                                    auVar85._0_4_)))),auVar99);
          auVar188 = ZEXT3264(auVar94);
          auVar105 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar152._12_4_ |
                                                   (uint)!bVar22 * auVar86._12_4_,
                                                   CONCAT48((uint)bVar20 * (int)auVar152._8_4_ |
                                                            (uint)!bVar20 * auVar86._8_4_,
                                                            CONCAT44((uint)bVar18 *
                                                                     (int)auVar152._4_4_ |
                                                                     (uint)!bVar18 * auVar86._4_4_,
                                                                     (uint)(bVar72 & 1) *
                                                                     (int)auVar152._0_4_ |
                                                                     (uint)!(bool)(bVar72 & 1) *
                                                                     auVar86._0_4_)))),auVar121);
          auVar104 = vsubps_avx(auVar103,auVar122);
          auVar193 = ZEXT3264(auVar104);
          auVar97 = vsubps_avx(auVar99,auVar123);
          auVar95 = vsubps_avx(auVar121,auVar124);
          auVar64._4_4_ = auVar105._4_4_ * fVar130;
          auVar64._0_4_ = auVar105._0_4_ * fVar83;
          auVar64._8_4_ = auVar105._8_4_ * fVar132;
          auVar64._12_4_ = auVar105._12_4_ * fVar134;
          auVar64._16_4_ = auVar105._16_4_ * 0.0;
          auVar64._20_4_ = auVar105._20_4_ * 0.0;
          auVar64._24_4_ = auVar105._24_4_ * 0.0;
          auVar64._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar64,auVar121,auVar98);
          auVar174._0_4_ = fVar84 * auVar98._0_4_;
          auVar174._4_4_ = fVar131 * auVar98._4_4_;
          auVar174._8_4_ = fVar133 * auVar98._8_4_;
          auVar174._12_4_ = fVar135 * auVar98._12_4_;
          auVar174._16_4_ = auVar98._16_4_ * 0.0;
          auVar174._20_4_ = auVar98._20_4_ * 0.0;
          auVar174._24_4_ = auVar98._24_4_ * 0.0;
          auVar174._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar174,auVar103,auVar94);
          auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar90,ZEXT1632(auVar85));
          auVar181._0_4_ = auVar94._0_4_ * auVar121._0_4_;
          auVar181._4_4_ = auVar94._4_4_ * auVar121._4_4_;
          auVar181._8_4_ = auVar94._8_4_ * auVar121._8_4_;
          auVar181._12_4_ = auVar94._12_4_ * auVar121._12_4_;
          auVar181._16_4_ = auVar94._16_4_ * fVar167;
          auVar181._20_4_ = auVar94._20_4_ * fVar136;
          auVar181._24_4_ = auVar94._24_4_ * fVar147;
          auVar181._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar181,auVar99,auVar105);
          auVar100 = vfmadd231ps_avx512vl(auVar96,auVar90,ZEXT1632(auVar85));
          auVar96 = vmulps_avx512vl(auVar95,auVar122);
          auVar96 = vfmsub231ps_avx512vl(auVar96,auVar104,auVar124);
          auVar65._4_4_ = auVar97._4_4_ * auVar124._4_4_;
          auVar65._0_4_ = auVar97._0_4_ * auVar124._0_4_;
          auVar65._8_4_ = auVar97._8_4_ * auVar124._8_4_;
          auVar65._12_4_ = auVar97._12_4_ * auVar124._12_4_;
          auVar65._16_4_ = auVar97._16_4_ * fVar166;
          auVar65._20_4_ = auVar97._20_4_ * fVar178;
          auVar65._24_4_ = auVar97._24_4_ * fVar177;
          auVar65._28_4_ = iVar2;
          auVar85 = vfmsub231ps_fma(auVar65,auVar123,auVar95);
          auVar182._0_4_ = auVar123._0_4_ * auVar104._0_4_;
          auVar182._4_4_ = auVar123._4_4_ * auVar104._4_4_;
          auVar182._8_4_ = auVar123._8_4_ * auVar104._8_4_;
          auVar182._12_4_ = auVar123._12_4_ * auVar104._12_4_;
          auVar182._16_4_ = fVar148 * auVar104._16_4_;
          auVar182._20_4_ = fVar176 * auVar104._20_4_;
          auVar182._24_4_ = fVar149 * auVar104._24_4_;
          auVar182._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar182,auVar97,auVar122);
          auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar90,auVar96);
          auVar102 = vfmadd231ps_avx512vl(auVar96,auVar90,ZEXT1632(auVar85));
          auVar183 = ZEXT3264(auVar102);
          auVar96 = vmaxps_avx(auVar100,auVar102);
          uVar23 = vcmpps_avx512vl(auVar96,auVar90,2);
          bVar81 = bVar81 & (byte)uVar23;
          if (bVar81 != 0) {
            auVar66._4_4_ = auVar95._4_4_ * auVar94._4_4_;
            auVar66._0_4_ = auVar95._0_4_ * auVar94._0_4_;
            auVar66._8_4_ = auVar95._8_4_ * auVar94._8_4_;
            auVar66._12_4_ = auVar95._12_4_ * auVar94._12_4_;
            auVar66._16_4_ = auVar95._16_4_ * auVar94._16_4_;
            auVar66._20_4_ = auVar95._20_4_ * auVar94._20_4_;
            auVar66._24_4_ = auVar95._24_4_ * auVar94._24_4_;
            auVar66._28_4_ = auVar96._28_4_;
            auVar7 = vfmsub231ps_fma(auVar66,auVar97,auVar105);
            auVar67._4_4_ = auVar105._4_4_ * auVar104._4_4_;
            auVar67._0_4_ = auVar105._0_4_ * auVar104._0_4_;
            auVar67._8_4_ = auVar105._8_4_ * auVar104._8_4_;
            auVar67._12_4_ = auVar105._12_4_ * auVar104._12_4_;
            auVar67._16_4_ = auVar105._16_4_ * auVar104._16_4_;
            auVar67._20_4_ = auVar105._20_4_ * auVar104._20_4_;
            auVar67._24_4_ = auVar105._24_4_ * auVar104._24_4_;
            auVar67._28_4_ = auVar105._28_4_;
            auVar6 = vfmsub231ps_fma(auVar67,auVar98,auVar95);
            auVar68._4_4_ = auVar97._4_4_ * auVar98._4_4_;
            auVar68._0_4_ = auVar97._0_4_ * auVar98._0_4_;
            auVar68._8_4_ = auVar97._8_4_ * auVar98._8_4_;
            auVar68._12_4_ = auVar97._12_4_ * auVar98._12_4_;
            auVar68._16_4_ = auVar97._16_4_ * auVar98._16_4_;
            auVar68._20_4_ = auVar97._20_4_ * auVar98._20_4_;
            auVar68._24_4_ = auVar97._24_4_ * auVar98._24_4_;
            auVar68._28_4_ = auVar97._28_4_;
            auVar8 = vfmsub231ps_fma(auVar68,auVar104,auVar94);
            auVar85 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar6),ZEXT1632(auVar8));
            auVar86 = vfmadd231ps_fma(ZEXT1632(auVar85),ZEXT1632(auVar7),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar96 = vrcp14ps_avx512vl(ZEXT1632(auVar86));
            auVar32._8_4_ = 0x3f800000;
            auVar32._0_8_ = 0x3f8000003f800000;
            auVar32._12_4_ = 0x3f800000;
            auVar32._16_4_ = 0x3f800000;
            auVar32._20_4_ = 0x3f800000;
            auVar32._24_4_ = 0x3f800000;
            auVar32._28_4_ = 0x3f800000;
            auVar94 = vfnmadd213ps_avx512vl(auVar96,ZEXT1632(auVar86),auVar32);
            auVar85 = vfmadd132ps_fma(auVar94,auVar96,auVar96);
            auVar188 = ZEXT1664(auVar85);
            auVar69._4_4_ = auVar8._4_4_ * auVar121._4_4_;
            auVar69._0_4_ = auVar8._0_4_ * auVar121._0_4_;
            auVar69._8_4_ = auVar8._8_4_ * auVar121._8_4_;
            auVar69._12_4_ = auVar8._12_4_ * auVar121._12_4_;
            auVar69._16_4_ = fVar167 * 0.0;
            auVar69._20_4_ = fVar136 * 0.0;
            auVar69._24_4_ = fVar147 * 0.0;
            auVar69._28_4_ = iVar1;
            auVar6 = vfmadd231ps_fma(auVar69,auVar99,ZEXT1632(auVar6));
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar103,ZEXT1632(auVar7));
            fVar136 = auVar85._0_4_;
            fVar147 = auVar85._4_4_;
            fVar148 = auVar85._8_4_;
            fVar149 = auVar85._12_4_;
            local_280._28_4_ = auVar96._28_4_;
            local_280._0_28_ =
                 ZEXT1628(CONCAT412(auVar6._12_4_ * fVar149,
                                    CONCAT48(auVar6._8_4_ * fVar148,
                                             CONCAT44(auVar6._4_4_ * fVar147,auVar6._0_4_ * fVar136)
                                            )));
            auVar193 = ZEXT3264(local_280);
            uVar23 = vcmpps_avx512vl(local_280,local_3e0,0xd);
            fVar167 = (ray->super_RayK<1>).tfar;
            auVar33._4_4_ = fVar167;
            auVar33._0_4_ = fVar167;
            auVar33._8_4_ = fVar167;
            auVar33._12_4_ = fVar167;
            auVar33._16_4_ = fVar167;
            auVar33._20_4_ = fVar167;
            auVar33._24_4_ = fVar167;
            auVar33._28_4_ = fVar167;
            uVar25 = vcmpps_avx512vl(local_280,auVar33,2);
            bVar81 = (byte)uVar23 & (byte)uVar25 & bVar81;
            if (bVar81 != 0) {
              uVar82 = vcmpps_avx512vl(ZEXT1632(auVar86),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar82 = bVar81 & uVar82;
              if ((char)uVar82 != '\0') {
                fVar167 = auVar100._0_4_ * fVar136;
                fVar176 = auVar100._4_4_ * fVar147;
                auVar70._4_4_ = fVar176;
                auVar70._0_4_ = fVar167;
                fVar177 = auVar100._8_4_ * fVar148;
                auVar70._8_4_ = fVar177;
                fVar178 = auVar100._12_4_ * fVar149;
                auVar70._12_4_ = fVar178;
                fVar166 = auVar100._16_4_ * 0.0;
                auVar70._16_4_ = fVar166;
                fVar83 = auVar100._20_4_ * 0.0;
                auVar70._20_4_ = fVar83;
                fVar84 = auVar100._24_4_ * 0.0;
                auVar70._24_4_ = fVar84;
                auVar70._28_4_ = auVar100._28_4_;
                auVar165._8_4_ = 0x3f800000;
                auVar165._0_8_ = 0x3f8000003f800000;
                auVar165._12_4_ = 0x3f800000;
                auVar165._16_4_ = 0x3f800000;
                auVar165._20_4_ = 0x3f800000;
                auVar165._24_4_ = 0x3f800000;
                auVar165._28_4_ = 0x3f800000;
                auVar96 = vsubps_avx(auVar165,auVar70);
                local_2c0._0_4_ =
                     (float)((uint)(bVar72 & 1) * (int)fVar167 |
                            (uint)!(bool)(bVar72 & 1) * auVar96._0_4_);
                bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar17 * (int)fVar176 | (uint)!bVar17 * auVar96._4_4_);
                bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar17 * (int)fVar177 | (uint)!bVar17 * auVar96._8_4_);
                bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar17 * (int)fVar178 | (uint)!bVar17 * auVar96._12_4_);
                bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar17 * (int)fVar166 | (uint)!bVar17 * auVar96._16_4_);
                bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar17 * (int)fVar83 | (uint)!bVar17 * auVar96._20_4_);
                bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar17 * (int)fVar84 | (uint)!bVar17 * auVar96._24_4_);
                bVar17 = SUB81(uVar73 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar17 * auVar100._28_4_ | (uint)!bVar17 * auVar96._28_4_);
                auVar96 = vsubps_avx(auVar101,auVar92);
                auVar85 = vfmadd213ps_fma(auVar96,local_2c0,auVar92);
                fVar167 = pre->depth_scale;
                auVar34._4_4_ = fVar167;
                auVar34._0_4_ = fVar167;
                auVar34._8_4_ = fVar167;
                auVar34._12_4_ = fVar167;
                auVar34._16_4_ = fVar167;
                auVar34._20_4_ = fVar167;
                auVar34._24_4_ = fVar167;
                auVar34._28_4_ = fVar167;
                auVar96 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar85._12_4_ + auVar85._12_4_,
                                                             CONCAT48(auVar85._8_4_ + auVar85._8_4_,
                                                                      CONCAT44(auVar85._4_4_ +
                                                                               auVar85._4_4_,
                                                                               auVar85._0_4_ +
                                                                               auVar85._0_4_)))),
                                          auVar34);
                uVar24 = vcmpps_avx512vl(local_280,auVar96,6);
                uVar82 = uVar82 & uVar24;
                bVar81 = (byte)uVar82;
                if (bVar81 != 0) {
                  auVar154._0_4_ = auVar102._0_4_ * fVar136;
                  auVar154._4_4_ = auVar102._4_4_ * fVar147;
                  auVar154._8_4_ = auVar102._8_4_ * fVar148;
                  auVar154._12_4_ = auVar102._12_4_ * fVar149;
                  auVar154._16_4_ = auVar102._16_4_ * 0.0;
                  auVar154._20_4_ = auVar102._20_4_ * 0.0;
                  auVar154._24_4_ = auVar102._24_4_ * 0.0;
                  auVar154._28_4_ = 0;
                  auVar175._8_4_ = 0x3f800000;
                  auVar175._0_8_ = 0x3f8000003f800000;
                  auVar175._12_4_ = 0x3f800000;
                  auVar175._16_4_ = 0x3f800000;
                  auVar175._20_4_ = 0x3f800000;
                  auVar175._24_4_ = 0x3f800000;
                  auVar175._28_4_ = 0x3f800000;
                  auVar96 = vsubps_avx(auVar175,auVar154);
                  auVar126._0_4_ =
                       (uint)(bVar72 & 1) * (int)auVar154._0_4_ |
                       (uint)!(bool)(bVar72 & 1) * auVar96._0_4_;
                  bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
                  auVar126._4_4_ =
                       (uint)bVar17 * (int)auVar154._4_4_ | (uint)!bVar17 * auVar96._4_4_;
                  bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
                  auVar126._8_4_ =
                       (uint)bVar17 * (int)auVar154._8_4_ | (uint)!bVar17 * auVar96._8_4_;
                  bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
                  auVar126._12_4_ =
                       (uint)bVar17 * (int)auVar154._12_4_ | (uint)!bVar17 * auVar96._12_4_;
                  bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
                  auVar126._16_4_ =
                       (uint)bVar17 * (int)auVar154._16_4_ | (uint)!bVar17 * auVar96._16_4_;
                  bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
                  auVar126._20_4_ =
                       (uint)bVar17 * (int)auVar154._20_4_ | (uint)!bVar17 * auVar96._20_4_;
                  bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
                  auVar126._24_4_ =
                       (uint)bVar17 * (int)auVar154._24_4_ | (uint)!bVar17 * auVar96._24_4_;
                  auVar126._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar96._28_4_;
                  auVar35._8_4_ = 0x40000000;
                  auVar35._0_8_ = 0x4000000040000000;
                  auVar35._12_4_ = 0x40000000;
                  auVar35._16_4_ = 0x40000000;
                  auVar35._20_4_ = 0x40000000;
                  auVar35._24_4_ = 0x40000000;
                  auVar35._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar126,auVar175,auVar35);
                  local_260 = (int)lVar78;
                  local_25c = iVar14;
                  local_250 = local_4d0._0_8_;
                  uStack_248 = local_4d0._8_8_;
                  local_240 = local_4c0._0_8_;
                  uStack_238 = local_4c0._8_8_;
                  local_230 = local_4f0._0_8_;
                  uStack_228 = local_4f0._8_8_;
                  local_220 = local_4e0;
                  uStack_218 = uStack_4d8;
                  pGVar15 = (context->scene->geometries).items[local_548].ptr;
                  if ((pGVar15->mask & (ray->super_RayK<1>).mask) != 0) {
                    uVar80 = (uint)uVar82;
                    auVar85 = vcvtsi2ss_avx512f(auVar89,(int)lVar78);
                    fVar167 = auVar85._0_4_;
                    local_200[0] = (fVar167 + local_2c0._0_4_ + 0.0) * local_120;
                    local_200[1] = (fVar167 + local_2c0._4_4_ + 1.0) * fStack_11c;
                    local_200[2] = (fVar167 + local_2c0._8_4_ + 2.0) * fStack_118;
                    local_200[3] = (fVar167 + local_2c0._12_4_ + 3.0) * fStack_114;
                    fStack_1f0 = (fVar167 + local_2c0._16_4_ + 4.0) * fStack_110;
                    fStack_1ec = (fVar167 + local_2c0._20_4_ + 5.0) * fStack_10c;
                    fStack_1e8 = (fVar167 + local_2c0._24_4_ + 6.0) * fStack_108;
                    fStack_1e4 = fVar167 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_280;
                    auVar144._8_4_ = 0x7f800000;
                    auVar144._0_8_ = 0x7f8000007f800000;
                    auVar144._12_4_ = 0x7f800000;
                    auVar144._16_4_ = 0x7f800000;
                    auVar144._20_4_ = 0x7f800000;
                    auVar144._24_4_ = 0x7f800000;
                    auVar144._28_4_ = 0x7f800000;
                    auVar96 = vblendmps_avx512vl(auVar144,local_280);
                    auVar127._0_4_ =
                         (uint)(bVar81 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar81 & 1) * 0x7f800000
                    ;
                    bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
                    auVar127._4_4_ = (uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
                    auVar127._8_4_ = (uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar82 >> 3) & 1);
                    auVar127._12_4_ = (uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar82 >> 4) & 1);
                    auVar127._16_4_ = (uint)bVar17 * auVar96._16_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar82 >> 5) & 1);
                    auVar127._20_4_ = (uint)bVar17 * auVar96._20_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar82 >> 6) & 1);
                    auVar127._24_4_ = (uint)bVar17 * auVar96._24_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = SUB81(uVar82 >> 7,0);
                    auVar127._28_4_ = (uint)bVar17 * auVar96._28_4_ | (uint)!bVar17 * 0x7f800000;
                    auVar96 = vshufps_avx(auVar127,auVar127,0xb1);
                    auVar96 = vminps_avx(auVar127,auVar96);
                    auVar94 = vshufpd_avx(auVar96,auVar96,5);
                    auVar96 = vminps_avx(auVar96,auVar94);
                    auVar94 = vpermpd_avx2(auVar96,0x4e);
                    auVar96 = vminps_avx(auVar96,auVar94);
                    uVar23 = vcmpps_avx512vl(auVar127,auVar96,0);
                    if (((byte)uVar23 & bVar81) != 0) {
                      uVar80 = (uint)((byte)uVar23 & bVar81);
                    }
                    uVar76 = 0;
                    for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
                      uVar76 = uVar76 + 1;
                    }
                    uVar73 = (ulong)uVar76;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar15->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_440 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                      local_140 = vmovdqa64_avx512vl(auVar208._0_32_);
                      local_460 = local_280;
                      local_4b0._0_8_ = pGVar15;
                      do {
                        local_494 = local_200[uVar73];
                        local_490 = *(undefined4 *)(local_1e0 + uVar73 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar73 * 4);
                        local_520.context = context->user;
                        fVar136 = 1.0 - local_494;
                        fVar167 = fVar136 * fVar136 * -3.0;
                        auVar183 = ZEXT464((uint)fVar167);
                        auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar136 * fVar136)),
                                                  ZEXT416((uint)(local_494 * fVar136)),
                                                  ZEXT416(0xc0000000));
                        auVar86 = vfmsub132ss_fma(ZEXT416((uint)(local_494 * fVar136)),
                                                  ZEXT416((uint)(local_494 * local_494)),
                                                  ZEXT416(0x40000000));
                        fVar136 = auVar85._0_4_ * 3.0;
                        fVar147 = auVar86._0_4_ * 3.0;
                        fVar148 = local_494 * local_494 * 3.0;
                        auVar186._0_4_ = fVar148 * (float)local_4e0._0_4_;
                        auVar186._4_4_ = fVar148 * (float)local_4e0._4_4_;
                        auVar186._8_4_ = fVar148 * (float)uStack_4d8;
                        auVar186._12_4_ = fVar148 * uStack_4d8._4_4_;
                        auVar188 = ZEXT1664(auVar186);
                        auVar159._4_4_ = fVar147;
                        auVar159._0_4_ = fVar147;
                        auVar159._8_4_ = fVar147;
                        auVar159._12_4_ = fVar147;
                        auVar85 = vfmadd132ps_fma(auVar159,auVar186,local_4f0);
                        auVar170._4_4_ = fVar136;
                        auVar170._0_4_ = fVar136;
                        auVar170._8_4_ = fVar136;
                        auVar170._12_4_ = fVar136;
                        auVar85 = vfmadd132ps_fma(auVar170,auVar85,local_4c0);
                        auVar160._4_4_ = fVar167;
                        auVar160._0_4_ = fVar167;
                        auVar160._8_4_ = fVar167;
                        auVar160._12_4_ = fVar167;
                        auVar85 = vfmadd132ps_fma(auVar160,auVar85,local_4d0);
                        local_4a0 = vmovlps_avx(auVar85);
                        local_498 = vextractps_avx(auVar85,2);
                        local_48c = (int)local_530;
                        local_488 = (int)local_548;
                        local_484 = (local_520.context)->instID[0];
                        local_480 = (local_520.context)->instPrimID[0];
                        local_54c = -1;
                        local_520.valid = &local_54c;
                        local_520.geometryUserPtr = *(void **)(local_4b0._0_8_ + 0x18);
                        local_520.ray = (RTCRayN *)ray;
                        local_520.hit = (RTCHitN *)&local_4a0;
                        local_520.N = 1;
                        if (*(code **)(local_4b0._0_8_ + 0x40) == (code *)0x0) {
LAB_01cebc43:
                          p_Var16 = context->args->filter;
                          if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_4b0._0_8_ + 0x3e) & 0x40) != 0)))) {
                            auVar183 = ZEXT1664(auVar183._0_16_);
                            auVar188 = ZEXT1664(auVar188._0_16_);
                            (*p_Var16)(&local_520);
                            auVar193 = ZEXT3264(local_460);
                            context = local_538;
                            ray = local_540;
                            if (*local_520.valid == 0) goto LAB_01cebce5;
                          }
                          (((Vec3f *)((long)local_520.ray + 0x30))->field_0).components[0] =
                               *(float *)local_520.hit;
                          (((Vec3f *)((long)local_520.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_520.hit + 4);
                          (((Vec3f *)((long)local_520.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_520.hit + 8);
                          *(float *)((long)local_520.ray + 0x3c) = *(float *)(local_520.hit + 0xc);
                          *(float *)((long)local_520.ray + 0x40) = *(float *)(local_520.hit + 0x10);
                          *(float *)((long)local_520.ray + 0x44) = *(float *)(local_520.hit + 0x14);
                          *(float *)((long)local_520.ray + 0x48) = *(float *)(local_520.hit + 0x18);
                          *(float *)((long)local_520.ray + 0x4c) = *(float *)(local_520.hit + 0x1c);
                          *(float *)((long)local_520.ray + 0x50) = *(float *)(local_520.hit + 0x20);
                        }
                        else {
                          auVar183 = ZEXT464((uint)fVar167);
                          auVar188 = ZEXT1664(auVar186);
                          (**(code **)(local_4b0._0_8_ + 0x40))(&local_520);
                          auVar193 = ZEXT3264(local_460);
                          context = local_538;
                          ray = local_540;
                          if (*local_520.valid != 0) goto LAB_01cebc43;
LAB_01cebce5:
                          (local_540->super_RayK<1>).tfar = (float)local_440._0_4_;
                          context = local_538;
                          ray = local_540;
                        }
                        bVar81 = ~(byte)(1 << ((uint)uVar73 & 0x1f)) & (byte)uVar82;
                        fVar167 = (ray->super_RayK<1>).tfar;
                        auVar36._4_4_ = fVar167;
                        auVar36._0_4_ = fVar167;
                        auVar36._8_4_ = fVar167;
                        auVar36._12_4_ = fVar167;
                        auVar36._16_4_ = fVar167;
                        auVar36._20_4_ = fVar167;
                        auVar36._24_4_ = fVar167;
                        auVar36._28_4_ = fVar167;
                        uVar23 = vcmpps_avx512vl(auVar193._0_32_,auVar36,2);
                        if ((bVar81 & (byte)uVar23) == 0) goto LAB_01cebd85;
                        local_440 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar81 = bVar81 & (byte)uVar23;
                        uVar80 = (uint)bVar81;
                        uVar82 = (ulong)uVar80;
                        auVar145._8_4_ = 0x7f800000;
                        auVar145._0_8_ = 0x7f8000007f800000;
                        auVar145._12_4_ = 0x7f800000;
                        auVar145._16_4_ = 0x7f800000;
                        auVar145._20_4_ = 0x7f800000;
                        auVar145._24_4_ = 0x7f800000;
                        auVar145._28_4_ = 0x7f800000;
                        auVar96 = vblendmps_avx512vl(auVar145,auVar193._0_32_);
                        auVar128._0_4_ =
                             (uint)(bVar81 & 1) * auVar96._0_4_ |
                             (uint)!(bool)(bVar81 & 1) * 0x7f800000;
                        bVar17 = (bool)(bVar81 >> 1 & 1);
                        auVar128._4_4_ = (uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar81 >> 2 & 1);
                        auVar128._8_4_ = (uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar81 >> 3 & 1);
                        auVar128._12_4_ = (uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * 0x7f800000
                        ;
                        bVar17 = (bool)(bVar81 >> 4 & 1);
                        auVar128._16_4_ = (uint)bVar17 * auVar96._16_4_ | (uint)!bVar17 * 0x7f800000
                        ;
                        bVar17 = (bool)(bVar81 >> 5 & 1);
                        auVar128._20_4_ = (uint)bVar17 * auVar96._20_4_ | (uint)!bVar17 * 0x7f800000
                        ;
                        bVar17 = (bool)(bVar81 >> 6 & 1);
                        auVar128._24_4_ = (uint)bVar17 * auVar96._24_4_ | (uint)!bVar17 * 0x7f800000
                        ;
                        auVar128._28_4_ =
                             (uint)(bVar81 >> 7) * auVar96._28_4_ |
                             (uint)!(bool)(bVar81 >> 7) * 0x7f800000;
                        auVar96 = vshufps_avx(auVar128,auVar128,0xb1);
                        auVar96 = vminps_avx(auVar128,auVar96);
                        auVar94 = vshufpd_avx(auVar96,auVar96,5);
                        auVar96 = vminps_avx(auVar96,auVar94);
                        auVar94 = vpermpd_avx2(auVar96,0x4e);
                        auVar96 = vminps_avx(auVar96,auVar94);
                        uVar23 = vcmpps_avx512vl(auVar128,auVar96,0);
                        bVar81 = (byte)uVar23 & bVar81;
                        if (bVar81 != 0) {
                          uVar80 = (uint)bVar81;
                        }
                        uVar76 = 0;
                        for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
                          uVar76 = uVar76 + 1;
                        }
                        uVar73 = (ulong)uVar76;
                      } while( true );
                    }
                    fVar167 = local_200[uVar73];
                    fVar136 = *(float *)(local_1e0 + uVar73 * 4);
                    fVar148 = 1.0 - fVar167;
                    fVar147 = fVar148 * fVar148 * -3.0;
                    auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148)),
                                              ZEXT416((uint)(fVar167 * fVar148)),ZEXT416(0xc0000000)
                                             );
                    auVar86 = vfmsub132ss_fma(ZEXT416((uint)(fVar167 * fVar148)),
                                              ZEXT416((uint)(fVar167 * fVar167)),ZEXT416(0x40000000)
                                             );
                    fVar148 = auVar85._0_4_ * 3.0;
                    fVar149 = auVar86._0_4_ * 3.0;
                    fVar176 = fVar167 * fVar167 * 3.0;
                    auVar185._0_4_ = fVar176 * (float)local_4e0._0_4_;
                    auVar185._4_4_ = fVar176 * (float)local_4e0._4_4_;
                    auVar185._8_4_ = fVar176 * (float)uStack_4d8;
                    auVar185._12_4_ = fVar176 * uStack_4d8._4_4_;
                    auVar188 = ZEXT1664(auVar185);
                    auVar157._4_4_ = fVar149;
                    auVar157._0_4_ = fVar149;
                    auVar157._8_4_ = fVar149;
                    auVar157._12_4_ = fVar149;
                    auVar85 = vfmadd132ps_fma(auVar157,auVar185,local_4f0);
                    auVar169._4_4_ = fVar148;
                    auVar169._0_4_ = fVar148;
                    auVar169._8_4_ = fVar148;
                    auVar169._12_4_ = fVar148;
                    auVar85 = vfmadd132ps_fma(auVar169,auVar85,local_4c0);
                    auVar158._4_4_ = fVar147;
                    auVar158._0_4_ = fVar147;
                    auVar158._8_4_ = fVar147;
                    auVar158._12_4_ = fVar147;
                    auVar183 = ZEXT464((uint)*(float *)(local_1c0 + uVar73 * 4));
                    (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar73 * 4);
                    auVar85 = vfmadd132ps_fma(auVar158,auVar85,local_4d0);
                    uVar23 = vmovlps_avx(auVar85);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar23;
                    fVar147 = (float)vextractps_avx(auVar85,2);
                    (ray->Ng).field_0.field_0.z = fVar147;
                    ray->u = fVar167;
                    ray->v = fVar136;
                    ray->primID = (uint)local_530;
                    ray->geomID = (uint)local_548;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01ceba8f;
      }
LAB_01ceb197:
      fVar167 = (ray->super_RayK<1>).tfar;
      auVar31._4_4_ = fVar167;
      auVar31._0_4_ = fVar167;
      auVar31._8_4_ = fVar167;
      auVar31._12_4_ = fVar167;
      auVar31._16_4_ = fVar167;
      auVar31._20_4_ = fVar167;
      auVar31._24_4_ = fVar167;
      auVar31._28_4_ = fVar167;
      uVar23 = vcmpps_avx512vl(local_80,auVar31,2);
      uVar80 = (uint)uVar79 & (uint)uVar79 + 0xff & (uint)uVar23;
      uVar79 = (ulong)uVar80;
    } while (uVar80 != 0);
  }
  return;
LAB_01cebd85:
  auVar96 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar205 = ZEXT3264(auVar96);
  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar207 = ZEXT1664(auVar85);
  auVar206 = ZEXT3264(local_420);
  auVar96 = vmovdqa64_avx512vl(local_140);
  auVar208 = ZEXT3264(auVar96);
  pre = local_528;
LAB_01ceba8f:
  lVar78 = lVar78 + 8;
  if (iVar14 <= (int)lVar78) goto LAB_01ceb197;
  goto LAB_01ceb222;
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }